

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  undefined4 uVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  int iVar36;
  undefined1 (*pauVar37) [64];
  int iVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  undefined1 (*pauVar42) [64];
  uint uVar43;
  undefined1 (*pauVar44) [64];
  uint uVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  undefined1 (*pauVar49) [64];
  undefined1 (*pauVar50) [64];
  ulong uVar51;
  uint uVar52;
  ushort uVar53;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar54 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar129 [48];
  undefined1 auVar71 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar72 [64];
  undefined1 auVar57 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar58 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar59 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar105 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar123 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  float _mean;
  float fVar130;
  float fVar132;
  undefined1 auVar131 [64];
  float fVar133;
  float fVar137;
  __m128 _b_128;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float _a;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float _b;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar176;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar190 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar191 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  ulong local_48;
  undefined1 auVar78 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar97 [64];
  undefined1 auVar104 [64];
  undefined1 auVar106 [64];
  undefined1 auVar108 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar124 [64];
  
  auVar131 = _DAT_00562140;
  iVar36 = bottom_top_blob->elempack;
  iVar38 = bottom_top_blob->dims;
  iVar40 = bottom_top_blob->w;
  pp_Var4 = this->_vptr_LayerNorm_x86_avx512;
  p_Var5 = pp_Var4[-3];
  pauVar50 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var5);
  pauVar44 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var5);
  if (iVar38 == 1) {
    uVar43 = iVar40 * iVar36;
    pauVar49 = (undefined1 (*) [64])bottom_top_blob->data;
    pauVar37 = pauVar49;
    if ((int)uVar43 < 0x10) {
      uVar48 = 0;
      auVar131 = ZEXT864(0);
    }
    else {
      uVar48 = uVar43 & 0x7ffffff0;
      auVar131 = ZEXT864(0);
      iVar36 = 0x10;
      do {
        auVar131 = vaddps_avx512f(auVar131,*pauVar37);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar43);
    }
    fVar130 = 0.0;
    fVar176 = 0.0;
    fVar133 = 0.0;
    fVar137 = 0.0;
    fVar138 = 0.0;
    fVar139 = 0.0;
    fVar140 = 0.0;
    fVar141 = 0.0;
    uVar52 = uVar48 | 8;
    while ((int)uVar52 <= (int)uVar43) {
      fVar133 = fVar133 + *(float *)*pauVar37;
      fVar137 = fVar137 + *(float *)(*pauVar37 + 4);
      fVar130 = fVar130 + *(float *)(*pauVar37 + 8);
      fVar176 = fVar176 + *(float *)(*pauVar37 + 0xc);
      fVar138 = fVar138 + *(float *)(*pauVar37 + 0x10);
      fVar139 = fVar139 + *(float *)(*pauVar37 + 0x14);
      fVar140 = fVar140 + *(float *)(*pauVar37 + 0x18);
      fVar141 = fVar141 + *(float *)(*pauVar37 + 0x1c);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar52 = uVar48 + 0x10;
      uVar48 = uVar48 + 8;
    }
    iVar36 = uVar48 + 4;
    auVar54 = ZEXT816(0) << 0x40;
    while (iVar36 <= (int)uVar43) {
      auVar57._0_4_ = auVar54._0_4_ + *(float *)*pauVar37;
      auVar57._4_4_ = auVar54._4_4_ + *(float *)(*pauVar37 + 4);
      auVar57._8_4_ = auVar54._8_4_ + *(float *)(*pauVar37 + 8);
      auVar57._12_4_ = auVar54._12_4_ + *(float *)(*pauVar37 + 0xc);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar48 + 8;
      auVar54 = auVar57;
      uVar48 = uVar48 + 4;
    }
    fVar144 = 0.0;
    if ((int)uVar48 < (int)uVar43) {
      auVar66 = vpbroadcastq_avx512f();
      uVar51 = 0;
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar65 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar70 = auVar65;
        auVar65 = vpbroadcastq_avx512f();
        auVar69 = vporq_avx512f(auVar65,auVar67);
        auVar65 = vporq_avx512f(auVar65,auVar68);
        uVar19 = vpcmpuq_avx512f(auVar65,auVar66,2);
        bVar30 = (byte)uVar19;
        uVar19 = vpcmpuq_avx512f(auVar69,auVar66,2);
        bVar31 = (byte)uVar19;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar51 * 4);
        auVar65._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar65._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar65._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar65._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar65._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar65._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar65._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar65._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar65._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar65._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar65._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar65._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar65._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar65._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar65._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar65._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar65 = vaddps_avx512f(auVar65,auVar70);
        uVar51 = uVar51 + 0x10;
      } while (((ulong)(~uVar48 + uVar43) + 0x10 & 0x1fffffff0) != uVar51);
      auVar66._0_4_ = (uint)(bVar30 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar70._0_4_
      ;
      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar6 * auVar65._4_4_ | (uint)!bVar6 * auVar70._4_4_;
      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar6 * auVar65._8_4_ | (uint)!bVar6 * auVar70._8_4_;
      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar66._12_4_ = (uint)bVar6 * auVar65._12_4_ | (uint)!bVar6 * auVar70._12_4_;
      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar66._16_4_ = (uint)bVar6 * auVar65._16_4_ | (uint)!bVar6 * auVar70._16_4_;
      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar66._20_4_ = (uint)bVar6 * auVar65._20_4_ | (uint)!bVar6 * auVar70._20_4_;
      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar66._24_4_ = (uint)bVar6 * auVar65._24_4_ | (uint)!bVar6 * auVar70._24_4_;
      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar66._28_4_ = (uint)bVar6 * auVar65._28_4_ | (uint)!bVar6 * auVar70._28_4_;
      auVar66._32_4_ =
           (uint)(bVar31 & 1) * auVar65._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar70._32_4_;
      bVar6 = (bool)(bVar31 >> 1 & 1);
      auVar66._36_4_ = (uint)bVar6 * auVar65._36_4_ | (uint)!bVar6 * auVar70._36_4_;
      bVar6 = (bool)(bVar31 >> 2 & 1);
      auVar66._40_4_ = (uint)bVar6 * auVar65._40_4_ | (uint)!bVar6 * auVar70._40_4_;
      bVar6 = (bool)(bVar31 >> 3 & 1);
      auVar66._44_4_ = (uint)bVar6 * auVar65._44_4_ | (uint)!bVar6 * auVar70._44_4_;
      bVar6 = (bool)(bVar31 >> 4 & 1);
      auVar66._48_4_ = (uint)bVar6 * auVar65._48_4_ | (uint)!bVar6 * auVar70._48_4_;
      bVar6 = (bool)(bVar31 >> 5 & 1);
      auVar66._52_4_ = (uint)bVar6 * auVar65._52_4_ | (uint)!bVar6 * auVar70._52_4_;
      bVar6 = (bool)(bVar31 >> 6 & 1);
      auVar66._56_4_ = (uint)bVar6 * auVar65._56_4_ | (uint)!bVar6 * auVar70._56_4_;
      auVar66._60_4_ =
           (uint)(bVar31 >> 7) * auVar65._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar70._60_4_;
      auVar60 = vextractf64x4_avx512f(auVar66,1);
      auVar65 = vaddps_avx512f(auVar66,ZEXT3264(auVar60));
      auVar58._0_4_ = auVar65._0_4_ + auVar65._16_4_;
      auVar58._4_4_ = auVar65._4_4_ + auVar65._20_4_;
      auVar58._8_4_ = auVar65._8_4_ + auVar65._24_4_;
      auVar58._12_4_ = auVar65._12_4_ + auVar65._28_4_;
      auVar57 = vshufpd_avx(auVar58,auVar58,1);
      auVar55._0_4_ = auVar58._0_4_ + auVar57._0_4_;
      auVar55._4_4_ = auVar58._4_4_ + auVar57._4_4_;
      auVar55._8_4_ = auVar58._8_4_ + auVar57._8_4_;
      auVar55._12_4_ = auVar58._12_4_ + auVar57._12_4_;
      auVar57 = vhaddps_avx(auVar55,auVar55);
      fVar144 = auVar57._0_4_;
    }
    auVar60 = vextractf64x4_avx512f(auVar131,1);
    fVar132 = auVar131._4_4_ + auVar60._4_4_;
    auVar59._0_4_ = auVar131._0_4_ + auVar60._0_4_ + auVar131._16_4_ + auVar60._16_4_;
    auVar59._4_4_ = fVar132 + fVar132;
    auVar59._8_4_ = auVar131._8_4_ + auVar60._8_4_ + auVar131._24_4_ + auVar60._24_4_;
    auVar59._12_4_ = auVar131._12_4_ + auVar60._12_4_ + auVar131._28_4_ + auVar60._28_4_;
    auVar57 = vshufpd_avx(auVar59,auVar59,1);
    auVar56._0_4_ = auVar57._0_4_ + auVar59._0_4_;
    auVar56._4_4_ = auVar57._4_4_ + auVar59._4_4_;
    auVar56._8_4_ = auVar57._8_4_ + auVar59._8_4_;
    auVar56._12_4_ = auVar57._12_4_ + auVar59._12_4_;
    auVar57 = vmovshdup_avx(auVar56);
    auVar134._0_4_ = fVar138 + fVar133;
    auVar134._4_4_ = fVar139 + fVar137;
    auVar134._8_4_ = fVar140 + fVar130;
    auVar134._12_4_ = fVar141 + fVar176;
    auVar58 = vshufps_avx(auVar54,auVar134,0x11);
    auVar54 = vshufps_avx(auVar54,auVar134,0xbb);
    auVar135._0_4_ = auVar54._0_4_ + auVar58._0_4_;
    auVar135._4_4_ = auVar54._4_4_ + auVar58._4_4_;
    auVar135._8_4_ = auVar54._8_4_ + auVar58._8_4_;
    auVar135._12_4_ = auVar54._12_4_ + auVar58._12_4_;
    auVar54 = vshufpd_avx(auVar135,auVar135,1);
    auVar136._0_4_ = auVar135._0_4_ + auVar54._0_4_;
    auVar136._4_4_ = auVar135._4_4_ + auVar54._4_4_;
    auVar136._8_4_ = auVar135._8_4_ + auVar54._8_4_;
    auVar136._12_4_ = auVar135._12_4_ + auVar54._12_4_;
    auVar54 = vhaddps_avx(auVar136,auVar136);
    auVar54._0_4_ = (auVar56._0_4_ + auVar57._0_4_ + fVar144 + auVar54._0_4_) / (float)(int)uVar43;
    auVar54._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar131 = vbroadcastss_avx512f(auVar54);
    pauVar37 = pauVar49;
    if ((int)uVar43 < 0x10) {
      uVar48 = 0;
      auVar65 = ZEXT864(0) << 0x20;
    }
    else {
      uVar48 = uVar43 & 0x7ffffff0;
      auVar65 = ZEXT864(0) << 0x40;
      iVar36 = 0x10;
      do {
        auVar66 = vsubps_avx512f(*pauVar37,auVar131);
        auVar65 = vfmadd231ps_avx512f(auVar65,auVar66,auVar66);
        pauVar37 = pauVar37 + 1;
        iVar36 = iVar36 + 0x10;
      } while (iVar36 <= (int)uVar43);
    }
    auVar57 = ZEXT816(0) << 0x40;
    uVar52 = uVar48 | 8;
    while ((int)uVar52 <= (int)uVar43) {
      auVar60 = vsubps_avx(*(undefined1 (*) [32])*pauVar37,auVar131._0_32_);
      auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar60,auVar60);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
      uVar52 = uVar48 + 0x10;
      uVar48 = uVar48 + 8;
    }
    auVar58 = ZEXT816(0) << 0x40;
    iVar36 = uVar48 + 4;
    while (iVar36 <= (int)uVar43) {
      auVar55 = vsubps_avx(*(undefined1 (*) [16])*pauVar37,auVar131._0_16_);
      auVar58 = vfmadd231ps_fma(auVar58,auVar55,auVar55);
      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
      iVar36 = uVar48 + 8;
      uVar48 = uVar48 + 4;
    }
    fVar130 = 0.0;
    if ((int)uVar48 < (int)uVar43) {
      auVar67 = vpbroadcastq_avx512f();
      uVar51 = 0;
      auVar68 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar69 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar66 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        auVar190 = auVar66;
        auVar66 = vpbroadcastq_avx512f();
        auVar70 = vporq_avx512f(auVar66,auVar68);
        auVar66 = vporq_avx512f(auVar66,auVar69);
        uVar19 = vpcmpuq_avx512f(auVar66,auVar67,2);
        bVar30 = (byte)uVar19;
        uVar19 = vpcmpuq_avx512f(auVar70,auVar67,2);
        bVar31 = (byte)uVar19;
        uVar53 = CONCAT11(bVar31,bVar30);
        piVar1 = (int *)(*pauVar37 + uVar51 * 4);
        auVar70._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
        auVar70._0_4_ = (uint)(bVar30 & 1) * *piVar1;
        auVar70._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
        auVar70._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
        auVar70._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
        auVar70._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
        auVar70._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
        auVar70._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
        auVar70._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
        auVar70._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
        auVar70._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
        auVar70._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
        auVar70._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
        auVar70._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
        auVar70._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
        auVar70._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
        auVar66 = vsubps_avx512f(auVar70,auVar131);
        auVar66 = vfmadd213ps_avx512f(auVar66,auVar66,auVar190);
        uVar51 = uVar51 + 0x10;
      } while (((ulong)(~uVar48 + uVar43) + 0x10 & 0x1fffffff0) != uVar51);
      auVar131._0_4_ =
           (uint)(bVar30 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar190._0_4_;
      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar6 * auVar66._4_4_ | (uint)!bVar6 * auVar190._4_4_;
      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar6 * auVar66._8_4_ | (uint)!bVar6 * auVar190._8_4_;
      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar6 * auVar66._12_4_ | (uint)!bVar6 * auVar190._12_4_;
      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar6 * auVar66._16_4_ | (uint)!bVar6 * auVar190._16_4_;
      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar6 * auVar66._20_4_ | (uint)!bVar6 * auVar190._20_4_;
      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar6 * auVar66._24_4_ | (uint)!bVar6 * auVar190._24_4_;
      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
      auVar131._28_4_ = (uint)bVar6 * auVar66._28_4_ | (uint)!bVar6 * auVar190._28_4_;
      auVar131._32_4_ =
           (uint)(bVar31 & 1) * auVar66._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar190._32_4_;
      bVar6 = (bool)(bVar31 >> 1 & 1);
      auVar131._36_4_ = (uint)bVar6 * auVar66._36_4_ | (uint)!bVar6 * auVar190._36_4_;
      bVar6 = (bool)(bVar31 >> 2 & 1);
      auVar131._40_4_ = (uint)bVar6 * auVar66._40_4_ | (uint)!bVar6 * auVar190._40_4_;
      bVar6 = (bool)(bVar31 >> 3 & 1);
      auVar131._44_4_ = (uint)bVar6 * auVar66._44_4_ | (uint)!bVar6 * auVar190._44_4_;
      bVar6 = (bool)(bVar31 >> 4 & 1);
      auVar131._48_4_ = (uint)bVar6 * auVar66._48_4_ | (uint)!bVar6 * auVar190._48_4_;
      bVar6 = (bool)(bVar31 >> 5 & 1);
      auVar131._52_4_ = (uint)bVar6 * auVar66._52_4_ | (uint)!bVar6 * auVar190._52_4_;
      bVar6 = (bool)(bVar31 >> 6 & 1);
      auVar131._56_4_ = (uint)bVar6 * auVar66._56_4_ | (uint)!bVar6 * auVar190._56_4_;
      auVar131._60_4_ =
           (uint)(bVar31 >> 7) * auVar66._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar190._60_4_;
      auVar60 = vextractf64x4_avx512f(auVar131,1);
      auVar131 = vaddps_avx512f(auVar131,ZEXT3264(auVar60));
      auVar145._0_4_ = auVar131._0_4_ + auVar131._16_4_;
      auVar145._4_4_ = auVar131._4_4_ + auVar131._20_4_;
      auVar145._8_4_ = auVar131._8_4_ + auVar131._24_4_;
      auVar145._12_4_ = auVar131._12_4_ + auVar131._28_4_;
      auVar55 = vshufpd_avx(auVar145,auVar145,1);
      auVar146._0_4_ = auVar145._0_4_ + auVar55._0_4_;
      auVar146._4_4_ = auVar145._4_4_ + auVar55._4_4_;
      auVar146._8_4_ = auVar145._8_4_ + auVar55._8_4_;
      auVar146._12_4_ = auVar145._12_4_ + auVar55._12_4_;
      auVar55 = vhaddps_avx(auVar146,auVar146);
      fVar130 = auVar55._0_4_;
    }
    auVar60 = vextractf64x4_avx512f(auVar65,1);
    fVar176 = auVar65._4_4_ + auVar60._4_4_;
    auVar142._0_4_ = auVar65._0_4_ + auVar60._0_4_ + auVar65._16_4_ + auVar60._16_4_;
    auVar142._4_4_ = fVar176 + fVar176;
    auVar142._8_4_ = auVar65._8_4_ + auVar60._8_4_ + auVar65._24_4_ + auVar60._24_4_;
    auVar142._12_4_ = auVar65._12_4_ + auVar60._12_4_ + auVar65._28_4_ + auVar60._28_4_;
    auVar55 = vshufpd_avx(auVar142,auVar142,1);
    auVar143._0_4_ = auVar55._0_4_ + auVar142._0_4_;
    auVar143._4_4_ = auVar55._4_4_ + auVar142._4_4_;
    auVar143._8_4_ = auVar55._8_4_ + auVar142._8_4_;
    auVar143._12_4_ = auVar55._12_4_ + auVar142._12_4_;
    auVar147._0_4_ = auVar57._0_4_ + 0.0;
    auVar147._4_4_ = auVar57._4_4_ + 0.0;
    auVar147._8_4_ = auVar57._8_4_ + 0.0;
    auVar147._12_4_ = auVar57._12_4_ + 0.0;
    auVar57 = vshufps_avx(auVar58,auVar147,0x11);
    auVar58 = vshufps_avx(auVar58,auVar147,0xbb);
    auVar148._0_4_ = auVar58._0_4_ + auVar57._0_4_;
    auVar148._4_4_ = auVar58._4_4_ + auVar57._4_4_;
    auVar148._8_4_ = auVar58._8_4_ + auVar57._8_4_;
    auVar148._12_4_ = auVar58._12_4_ + auVar57._12_4_;
    auVar57 = vshufpd_avx(auVar148,auVar148,1);
    auVar149._0_4_ = auVar148._0_4_ + auVar57._0_4_;
    auVar149._4_4_ = auVar148._4_4_ + auVar57._4_4_;
    auVar149._8_4_ = auVar148._8_4_ + auVar57._8_4_;
    auVar149._12_4_ = auVar148._12_4_ + auVar57._12_4_;
    auVar57 = vhaddps_avx(auVar149,auVar149);
    auVar58 = vmovshdup_avx(auVar143);
    fVar130 = (auVar143._0_4_ + auVar58._0_4_ + fVar130 + auVar57._0_4_) / (float)(int)uVar43 +
              *(float *)(&this->field_0xd4 + (long)p_Var5);
    auVar57 = vrsqrtss_avx(ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
    auVar58 = vfmadd213ss_fma(ZEXT416((uint)(fVar130 * auVar57._0_4_)),auVar57,ZEXT416(0xc0400000));
    fVar130 = auVar57._0_4_ * -0.5 * auVar58._0_4_;
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar54 = vxorps_avx512vl(auVar54,auVar23);
    auVar131 = vbroadcastss_avx512f(ZEXT416((uint)fVar130));
    auVar54 = ZEXT416((uint)(fVar130 * auVar54._0_4_));
    auVar65 = vbroadcastss_avx512f(auVar54);
    if (*(int *)(&this->field_0xd8 + (long)p_Var5) == 0) {
      uVar48 = 0;
      if (0xf < (int)uVar43) {
        uVar48 = uVar43 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar66 = vfmadd132ps_avx512f(*pauVar49,auVar65,auVar131);
          *pauVar49 = auVar66;
          pauVar49 = pauVar49 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar43);
      }
      uVar52 = uVar48 | 8;
      while ((int)uVar52 <= (int)uVar43) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar65._0_32_,auVar131._0_32_);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar54);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        uVar52 = uVar48 + 0x10;
        uVar48 = uVar48 + 8;
      }
      iVar36 = uVar48 + 4;
      while (iVar36 <= (int)uVar43) {
        auVar54 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar65._0_16_,auVar131._0_16_);
        *(undefined1 (*) [16])*pauVar49 = auVar54;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        iVar36 = uVar48 + 8;
        uVar48 = uVar48 + 4;
      }
      if ((int)uVar48 < (int)uVar43) {
        auVar66 = vpbroadcastq_avx512f();
        uVar51 = 0;
        auVar67 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar69 = vpbroadcastq_avx512f();
          auVar70 = vporq_avx512f(auVar69,auVar67);
          auVar69 = vporq_avx512f(auVar69,auVar68);
          uVar19 = vpcmpuq_avx512f(auVar69,auVar66,2);
          bVar30 = (byte)uVar19;
          uVar19 = vpcmpuq_avx512f(auVar70,auVar66,2);
          bVar31 = (byte)uVar19;
          uVar53 = CONCAT11(bVar31,bVar30);
          piVar1 = (int *)(*pauVar49 + uVar51 * 4);
          auVar69._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
          auVar69._0_4_ = (uint)(bVar30 & 1) * *piVar1;
          auVar69._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
          auVar69._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
          auVar69._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
          auVar69._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
          auVar69._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
          auVar69._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
          auVar69._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
          auVar69._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
          auVar69._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
          auVar69._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
          auVar69._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
          auVar69._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
          auVar69._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
          auVar69._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
          auVar69 = vfmadd213ps_avx512f(auVar69,auVar131,auVar65);
          puVar2 = (uint *)(*pauVar49 + uVar51 * 4);
          bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar53 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar53 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar53 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar53 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar53 >> 7) & 1);
          bVar13 = (bool)(bVar31 >> 1 & 1);
          bVar14 = (bool)(bVar31 >> 2 & 1);
          bVar15 = (bool)(bVar31 >> 3 & 1);
          bVar16 = (bool)(bVar31 >> 4 & 1);
          bVar17 = (bool)(bVar31 >> 5 & 1);
          bVar18 = (bool)(bVar31 >> 6 & 1);
          *puVar2 = (uint)(bVar30 & 1) * auVar69._0_4_ | (uint)!(bool)(bVar30 & 1) * *puVar2;
          puVar2[1] = (uint)bVar6 * auVar69._4_4_ | (uint)!bVar6 * puVar2[1];
          puVar2[2] = (uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * puVar2[2];
          puVar2[3] = (uint)bVar9 * auVar69._12_4_ | (uint)!bVar9 * puVar2[3];
          puVar2[4] = (uint)bVar10 * auVar69._16_4_ | (uint)!bVar10 * puVar2[4];
          puVar2[5] = (uint)bVar7 * auVar69._20_4_ | (uint)!bVar7 * puVar2[5];
          puVar2[6] = (uint)bVar11 * auVar69._24_4_ | (uint)!bVar11 * puVar2[6];
          puVar2[7] = (uint)bVar12 * auVar69._28_4_ | (uint)!bVar12 * puVar2[7];
          puVar2[8] = (uint)(bVar31 & 1) * auVar69._32_4_ | (uint)!(bool)(bVar31 & 1) * puVar2[8];
          puVar2[9] = (uint)bVar13 * auVar69._36_4_ | (uint)!bVar13 * puVar2[9];
          puVar2[10] = (uint)bVar14 * auVar69._40_4_ | (uint)!bVar14 * puVar2[10];
          puVar2[0xb] = (uint)bVar15 * auVar69._44_4_ | (uint)!bVar15 * puVar2[0xb];
          puVar2[0xc] = (uint)bVar16 * auVar69._48_4_ | (uint)!bVar16 * puVar2[0xc];
          puVar2[0xd] = (uint)bVar17 * auVar69._52_4_ | (uint)!bVar17 * puVar2[0xd];
          puVar2[0xe] = (uint)bVar18 * auVar69._56_4_ | (uint)!bVar18 * puVar2[0xe];
          puVar2[0xf] = (uint)(bVar31 >> 7) * auVar69._60_4_ |
                        (uint)!(bool)(bVar31 >> 7) * puVar2[0xf];
          uVar51 = uVar51 + 0x10;
        } while (((ulong)(uVar43 + ~uVar48) + 0x10 & 0x1fffffff0) != uVar51);
      }
    }
    else {
      uVar48 = 0;
      if (0xf < (int)uVar43) {
        uVar48 = uVar43 & 0x7ffffff0;
        iVar36 = 0x10;
        do {
          auVar66 = vfmadd132ps_avx512f(*pauVar49,auVar65,auVar131);
          auVar66 = vfmadd213ps_avx512f(auVar66,*pauVar50,*pauVar44);
          *pauVar49 = auVar66;
          pauVar49 = pauVar49 + 1;
          pauVar50 = pauVar50 + 1;
          pauVar44 = pauVar44 + 1;
          iVar36 = iVar36 + 0x10;
        } while (iVar36 <= (int)uVar43);
      }
      uVar52 = uVar48 | 8;
      while ((int)uVar52 <= (int)uVar43) {
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar49,auVar65._0_32_,auVar131._0_32_);
        auVar57 = vfmadd213ps_fma(ZEXT1632(auVar57),*(undefined1 (*) [32])*pauVar50,
                                  *(undefined1 (*) [32])*pauVar44);
        *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar57);
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x20);
        pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x20);
        uVar52 = uVar48 + 0x10;
        uVar48 = uVar48 + 8;
      }
      iVar36 = uVar48 + 4;
      while (iVar36 <= (int)uVar43) {
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar49,auVar65._0_16_,auVar131._0_16_);
        auVar57 = vfmadd213ps_fma(auVar57,*(undefined1 (*) [16])*pauVar50,
                                  *(undefined1 (*) [16])*pauVar44);
        *(undefined1 (*) [16])*pauVar49 = auVar57;
        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
        pauVar50 = (undefined1 (*) [64])(*pauVar50 + 0x10);
        pauVar44 = (undefined1 (*) [64])(*pauVar44 + 0x10);
        iVar36 = uVar48 + 8;
        uVar48 = uVar48 + 4;
      }
      if (uVar43 - uVar48 != 0 && (int)uVar48 <= (int)uVar43) {
        lVar47 = 0;
        do {
          auVar57 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                    ZEXT416((uint)fVar130));
          auVar57 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar50 + lVar47 * 4)),auVar57,
                                    ZEXT416(*(uint *)(*pauVar44 + lVar47 * 4)));
          *(int *)(*pauVar49 + lVar47 * 4) = auVar57._0_4_;
          lVar47 = lVar47 + 1;
        } while (uVar43 - uVar48 != (int)lVar47);
      }
    }
  }
  else {
    uVar43 = bottom_top_blob->h;
    auVar54 = in_ZMM25._0_16_;
    if (iVar38 == 3) {
      uVar48 = bottom_top_blob->c;
      if (*(int *)(&this->field_0xd0 + (long)p_Var5) == iVar40) {
        if (0 < (int)uVar48) {
          uVar45 = iVar40 * iVar36;
          fVar130 = 1.0 / (float)iVar40;
          auVar65 = vbroadcastss_avx512f(ZEXT416((uint)fVar130));
          uVar52 = uVar45 & 0xfffffff0;
          local_48 = 0;
          auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar97._0_16_ = vxorps_avx512vl(auVar54,auVar54);
          auVar181._8_4_ = 0x80000000;
          auVar181._0_8_ = 0x8000000080000000;
          auVar181._12_4_ = 0x80000000;
          auVar184._8_4_ = 0xc0400000;
          auVar184._0_8_ = 0xc0400000c0400000;
          auVar184._12_4_ = 0xc0400000;
          auVar187._8_4_ = 0xc0400000;
          auVar187._0_8_ = 0xc0400000c0400000;
          auVar187._12_4_ = 0xc0400000;
          auVar187._16_4_ = 0xc0400000;
          auVar187._20_4_ = 0xc0400000;
          auVar187._24_4_ = 0xc0400000;
          auVar187._28_4_ = 0xc0400000;
          auVar189._8_4_ = 0x80000000;
          auVar189._0_8_ = 0x8000000080000000;
          auVar189._12_4_ = 0x80000000;
          auVar189._16_4_ = 0x80000000;
          auVar189._20_4_ = 0x80000000;
          auVar189._24_4_ = 0x80000000;
          auVar189._28_4_ = 0x80000000;
          auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
          auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
          auVar190 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar68 = auVar190;
          do {
            if (0 < (int)uVar43) {
              uVar51 = 0;
              do {
                auVar57 = in_ZMM17._0_16_;
                auVar54 = in_ZMM22._0_16_;
                pauVar49 = (undefined1 (*) [64])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar51 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * local_48 * bottom_top_blob->elemsize);
                auVar129 = auVar68._16_48_;
                auVar58 = in_ZMM18._0_16_;
                pauVar37 = pauVar49;
                if ((int)uVar45 < 0x10) {
                  auVar58 = vxorps_avx512vl(auVar58,auVar58);
                  auVar68 = ZEXT1664(auVar58);
                  uVar39 = 0;
                }
                else {
                  auVar58 = vxorps_avx512vl(auVar58,auVar58);
                  auVar68 = ZEXT1664(auVar58);
                  iVar38 = 0x10;
                  do {
                    auVar68 = vaddps_avx512f(auVar68,*pauVar37);
                    auVar129 = auVar68._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar52;
                  } while (iVar38 <= (int)uVar45);
                }
                auVar58 = auVar68._0_16_;
                uVar41 = uVar39 | 8;
                auVar92._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                auVar92._16_48_ = auVar129;
                auVar191 = ZEXT1664(auVar92._0_16_);
                auVar60 = auVar129._16_32_;
                auVar61 = ZEXT1632(auVar92._0_16_);
                while ((int)uVar41 <= (int)uVar45) {
                  auVar92._0_32_ = vaddps_avx512vl(auVar191._0_32_,*(undefined1 (*) [32])*pauVar37);
                  auVar191 = ZEXT3264(auVar92._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar41 = uVar39 + 0x10;
                  auVar60 = auVar92._32_32_;
                  auVar61 = auVar92._0_32_;
                  uVar39 = uVar39 + 8;
                }
                auVar59 = auVar61._0_16_;
                iVar38 = uVar39 + 4;
                auVar55 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
                while (iVar38 <= (int)uVar45) {
                  auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                auVar56 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
                in_ZMM19 = ZEXT1664(auVar56);
                auVar56 = ZEXT816(0) << 0x40;
                if ((int)uVar39 < (int)uVar45) {
                  auVar72 = vpbroadcastq_avx512f();
                  auVar54 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
                  uVar46 = 0;
                  auVar191 = ZEXT1664(auVar54);
                  do {
                    auVar113 = auVar191;
                    auVar191 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar191,auVar66);
                    auVar54 = auVar73._0_16_;
                    auVar191 = vporq_avx512f(auVar191,auVar67);
                    uVar19 = vpcmpuq_avx512f(auVar191,auVar72,2);
                    bVar30 = (byte)uVar19;
                    uVar19 = vpcmpuq_avx512f(auVar73,auVar72,2);
                    bVar31 = (byte)uVar19;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar93._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar93._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar93._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar93._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar93._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar93._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar93._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar93._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar93._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar93._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar93._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar93._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar93._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar93._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar93._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar93._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar191 = vaddps_avx512f(auVar93,auVar113);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar94._0_4_ =
                       (uint)(bVar30 & 1) * auVar191._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar113._0_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar94._4_4_ = (uint)bVar6 * auVar191._4_4_ | (uint)!bVar6 * auVar113._4_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar94._8_4_ = (uint)bVar6 * auVar191._8_4_ | (uint)!bVar6 * auVar113._8_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar94._12_4_ = (uint)bVar6 * auVar191._12_4_ | (uint)!bVar6 * auVar113._12_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar94._16_4_ = (uint)bVar6 * auVar191._16_4_ | (uint)!bVar6 * auVar113._16_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar94._20_4_ = (uint)bVar6 * auVar191._20_4_ | (uint)!bVar6 * auVar113._20_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar94._24_4_ = (uint)bVar6 * auVar191._24_4_ | (uint)!bVar6 * auVar113._24_4_;
                  bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar94._28_4_ = (uint)bVar6 * auVar191._28_4_ | (uint)!bVar6 * auVar113._28_4_;
                  auVar94._32_4_ =
                       (uint)(bVar31 & 1) * auVar191._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar113._32_4_;
                  bVar6 = (bool)(bVar31 >> 1 & 1);
                  auVar94._36_4_ = (uint)bVar6 * auVar191._36_4_ | (uint)!bVar6 * auVar113._36_4_;
                  bVar6 = (bool)(bVar31 >> 2 & 1);
                  auVar94._40_4_ = (uint)bVar6 * auVar191._40_4_ | (uint)!bVar6 * auVar113._40_4_;
                  bVar6 = (bool)(bVar31 >> 3 & 1);
                  auVar94._44_4_ = (uint)bVar6 * auVar191._44_4_ | (uint)!bVar6 * auVar113._44_4_;
                  bVar6 = (bool)(bVar31 >> 4 & 1);
                  auVar94._48_4_ = (uint)bVar6 * auVar191._48_4_ | (uint)!bVar6 * auVar113._48_4_;
                  bVar6 = (bool)(bVar31 >> 5 & 1);
                  auVar94._52_4_ = (uint)bVar6 * auVar191._52_4_ | (uint)!bVar6 * auVar113._52_4_;
                  bVar6 = (bool)(bVar31 >> 6 & 1);
                  auVar94._56_4_ = (uint)bVar6 * auVar191._56_4_ | (uint)!bVar6 * auVar113._56_4_;
                  auVar94._60_4_ =
                       (uint)(bVar31 >> 7) * auVar191._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar113._60_4_;
                  auVar60 = vextractf64x4_avx512f(auVar94,1);
                  auVar191 = vaddps_avx512f(auVar94,ZEXT3264(auVar60));
                  auVar57 = vextractf32x4_avx512vl(auVar191._0_32_,1);
                  auVar56 = vaddps_avx512vl(auVar191._0_16_,auVar57);
                  auVar57 = vshufpd_avx512vl(auVar56,auVar56,1);
                  auVar56 = vaddps_avx512vl(auVar56,auVar57);
                  auVar60 = auVar191._32_32_;
                  auVar56 = vhaddps_avx(auVar56,auVar56);
                }
                in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
                auVar54 = vpxord_avx512vl(auVar54,auVar54);
                auVar57 = vxorps_avx512vl(auVar57,auVar57);
                in_ZMM17 = ZEXT1664(auVar57);
                auVar57 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
                bVar6 = false;
                auVar62 = auVar68._0_32_;
                auVar191 = ZEXT1664(auVar57);
                if (iVar36 < 8) {
                  if (iVar36 == 1) {
                    auVar63 = vextractf64x4_avx512f(auVar68,1);
                    auVar62 = vaddps_avx512vl(auVar62,auVar63);
                    auVar54 = vextractf32x4_avx512vl(auVar62,1);
                    auVar57 = vaddps_avx512vl(auVar62._0_16_,auVar54);
                    auVar58 = vshufpd_avx512vl(auVar57,auVar57,1);
                    auVar54 = vextractf32x4_avx512vl(auVar61,1);
                    auVar54 = vaddps_avx512vl(auVar54,auVar59);
                    auVar59 = vshufps_avx512vl(auVar55,auVar54,0x11);
                    auVar54 = vshufps_avx512vl(auVar55,auVar54,0xbb);
                    auVar54 = vaddps_avx512vl(auVar54,auVar59);
                    auVar59 = vshufpd_avx512vl(auVar54,auVar54,1);
                    auVar54 = vaddps_avx512vl(auVar54,auVar59);
                    auVar54 = vhaddps_avx(auVar54,auVar54);
                    auVar57 = vaddps_avx512vl(auVar58,auVar57);
                    auVar58 = vmovshdup_avx512vl(auVar57);
                    auVar56 = vaddss_avx512f(auVar58,auVar56);
                    auVar57 = vaddss_avx512f(auVar57,auVar56);
                    auVar54 = vmulss_avx512f(ZEXT416((uint)(auVar57._0_4_ + auVar54._0_4_)),
                                             ZEXT416((uint)fVar130));
                    in_ZMM19 = ZEXT1664(auVar54);
                    auVar95._0_32_ = vbroadcastss_avx512vl(auVar54);
                    auVar95._32_32_ = auVar60;
                    auVar97._16_48_ = auVar95._16_48_;
                    auVar96._4_60_ = auVar97._4_60_;
                    auVar96._0_4_ = auVar95._0_4_;
                    in_ZMM17 = ZEXT1664(auVar96._0_16_);
                    bVar9 = true;
                    bVar6 = false;
                    auVar54 = auVar95._0_16_;
                  }
                  else {
                    bVar9 = false;
                    bVar8 = false;
                    if (iVar36 != 4) goto LAB_004d5707;
                    auVar60 = vextractf64x4_avx512f(auVar68,1);
                    auVar61 = vaddps_avx512vl(auVar62,auVar61);
                    fVar176 = auVar61._4_4_ + auVar60._4_4_;
                    auVar156._0_4_ = auVar61._16_4_ + auVar60._16_4_ + auVar61._0_4_ + auVar60._0_4_
                    ;
                    auVar156._4_4_ = fVar176 + fVar176;
                    auVar156._8_4_ = auVar61._24_4_ + auVar60._24_4_ + auVar61._8_4_ + auVar60._8_4_
                    ;
                    auVar156._12_4_ =
                         auVar61._28_4_ + auVar60._28_4_ + auVar61._12_4_ + auVar60._12_4_;
                    auVar54 = vaddps_avx512vl(auVar156,auVar55);
                    auVar54 = vmulps_avx512vl(auVar54,auVar65._0_16_);
                    in_ZMM17 = ZEXT1664(auVar54);
                    auVar95._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar54),auVar54,1);
                    bVar6 = true;
                    bVar9 = false;
                    in_ZMM19 = in_ZMM17;
                  }
                  bVar8 = false;
                  auVar191 = ZEXT3264(auVar95._0_32_);
LAB_004d5707:
                  auVar60 = auVar191._0_32_;
                  auVar68 = vinsertf64x4_avx512f(auVar191,auVar60,1);
                  bVar10 = false;
                }
                else {
                  if (iVar36 == 8) {
                    auVar60 = vextractf64x4_avx512f(auVar68,1);
                    auVar61 = vaddps_avx512vl(auVar62,auVar61);
                    auVar171._0_4_ = auVar61._0_4_ + auVar60._0_4_;
                    auVar171._4_4_ = auVar61._4_4_ + auVar60._4_4_;
                    auVar171._8_4_ = auVar61._8_4_ + auVar60._8_4_;
                    auVar171._12_4_ = auVar61._12_4_ + auVar60._12_4_;
                    auVar171._16_4_ = auVar61._16_4_ + auVar60._16_4_;
                    auVar171._20_4_ = auVar61._20_4_ + auVar60._20_4_;
                    auVar171._24_4_ = auVar61._24_4_ + auVar60._24_4_;
                    auVar171._28_4_ = auVar61._28_4_ + auVar60._28_4_;
                    auVar60 = vmulps_avx512vl(auVar171,auVar65._0_32_);
                    in_ZMM17 = ZEXT3264(auVar60);
                    auVar54 = vbroadcastss_avx512vl(auVar60._0_16_);
                    bVar8 = true;
                    bVar6 = false;
                    in_ZMM19 = ZEXT1664(auVar60._0_16_);
                    bVar9 = false;
                    auVar191 = in_ZMM17;
                    goto LAB_004d5707;
                  }
                  bVar9 = false;
                  bVar8 = false;
                  if (iVar36 != 0x10) goto LAB_004d5707;
                  auVar68 = vmulps_avx512f(auVar68,auVar65);
                  auVar60 = vbroadcastss_avx512vl(auVar68._0_16_);
                  bVar10 = true;
                  bVar6 = false;
                  bVar9 = false;
                  auVar54 = auVar60._0_16_;
                  bVar8 = false;
                  in_ZMM17 = auVar68;
                  in_ZMM19 = auVar68;
                }
                auVar129 = auVar68._16_48_;
                pauVar37 = pauVar49;
                if ((int)uVar45 < 0x10) {
                  auVar57 = vxorps_avx512vl(auVar59,auVar59);
                  in_ZMM21 = ZEXT1664(auVar57);
                  uVar39 = 0;
                }
                else {
                  auVar57 = vxorps_avx512vl(auVar59,auVar59);
                  in_ZMM21 = ZEXT1664(auVar57);
                  iVar38 = 0x10;
                  do {
                    auVar191 = vsubps_avx512f(*pauVar37,auVar68);
                    in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar191,auVar191);
                    auVar129 = in_ZMM21._16_48_;
                    pauVar37 = pauVar37 + 1;
                    iVar38 = iVar38 + 0x10;
                    uVar39 = uVar52;
                  } while (iVar38 <= (int)uVar45);
                }
                uVar41 = uVar39 | 8;
                auVar98._0_16_ = vxorps_avx512vl(auVar55,auVar55);
                auVar98._16_48_ = auVar129;
                in_ZMM23 = ZEXT1664(auVar98._0_16_);
                auVar61 = auVar129._16_32_;
                while ((int)uVar41 <= (int)uVar45) {
                  auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar60);
                  auVar98._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar61,auVar61);
                  in_ZMM23 = ZEXT3264(auVar98._0_32_);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                  uVar41 = uVar39 + 0x10;
                  auVar61 = auVar98._32_32_;
                  uVar39 = uVar39 + 8;
                }
                iVar38 = uVar39 + 4;
                auVar57 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
                while (iVar38 <= (int)uVar45) {
                  auVar55 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,auVar54);
                  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar55,auVar55);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = uVar39 + 8;
                  uVar39 = uVar39 + 4;
                }
                auVar54 = ZEXT816(0) << 0x40;
                if ((int)uVar39 < (int)uVar45) {
                  auVar68 = vpbroadcastq_avx512f();
                  auVar191 = vbroadcastss_avx512f(in_ZMM19._0_16_);
                  auVar58 = auVar191._0_16_;
                  auVar54 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
                  uVar46 = 0;
                  in_ZMM26 = ZEXT1664(auVar54);
                  do {
                    auVar113 = in_ZMM26;
                    auVar72 = vpbroadcastq_avx512f();
                    auVar73 = vporq_avx512f(auVar72,auVar66);
                    auVar72 = vporq_avx512f(auVar72,auVar67);
                    uVar19 = vpcmpuq_avx512f(auVar72,auVar68,2);
                    bVar30 = (byte)uVar19;
                    uVar19 = vpcmpuq_avx512f(auVar73,auVar68,2);
                    bVar31 = (byte)uVar19;
                    uVar53 = CONCAT11(bVar31,bVar30);
                    piVar1 = (int *)(*pauVar37 + uVar46 * 4);
                    auVar99._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                    auVar99._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                    auVar99._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                    auVar99._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                    auVar99._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                    auVar99._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                    auVar99._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                    auVar99._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                    auVar99._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                    auVar99._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                    auVar99._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                    auVar99._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                    auVar99._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                    auVar99._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                    auVar99._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                    auVar99._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                    auVar72 = vsubps_avx512f(auVar99,auVar191);
                    in_ZMM26 = vfmadd213ps_avx512f(auVar72,auVar72,auVar113);
                    uVar46 = uVar46 + 0x10;
                  } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  auVar100._0_4_ =
                       (uint)(bVar30 & 1) * in_ZMM26._0_4_ |
                       (uint)!(bool)(bVar30 & 1) * auVar113._0_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar100._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar113._4_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar100._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar113._8_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar100._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar113._12_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar100._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar113._16_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar100._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar113._20_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar100._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar113._24_4_;
                  bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
                  auVar100._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar113._28_4_;
                  auVar100._32_4_ =
                       (uint)(bVar31 & 1) * in_ZMM26._32_4_ |
                       (uint)!(bool)(bVar31 & 1) * auVar113._32_4_;
                  bVar7 = (bool)(bVar31 >> 1 & 1);
                  auVar100._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar113._36_4_;
                  bVar7 = (bool)(bVar31 >> 2 & 1);
                  auVar100._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar113._40_4_;
                  bVar7 = (bool)(bVar31 >> 3 & 1);
                  auVar100._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar113._44_4_;
                  bVar7 = (bool)(bVar31 >> 4 & 1);
                  auVar100._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar113._48_4_;
                  bVar7 = (bool)(bVar31 >> 5 & 1);
                  auVar100._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar113._52_4_;
                  bVar7 = (bool)(bVar31 >> 6 & 1);
                  auVar100._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar113._56_4_;
                  auVar100._60_4_ =
                       (uint)(bVar31 >> 7) * in_ZMM26._60_4_ |
                       (uint)!(bool)(bVar31 >> 7) * auVar113._60_4_;
                  auVar60 = vextractf64x4_avx512f(auVar100,1);
                  auVar68 = vaddps_avx512f(auVar100,ZEXT3264(auVar60));
                  auVar61 = auVar68._32_32_;
                  auVar157._0_4_ = auVar68._0_4_ + auVar68._16_4_;
                  auVar157._4_4_ = auVar68._4_4_ + auVar68._20_4_;
                  auVar157._8_4_ = auVar68._8_4_ + auVar68._24_4_;
                  auVar157._12_4_ = auVar68._12_4_ + auVar68._28_4_;
                  auVar54 = vshufpd_avx(auVar157,auVar157,1);
                  auVar158._0_4_ = auVar157._0_4_ + auVar54._0_4_;
                  auVar158._4_4_ = auVar157._4_4_ + auVar54._4_4_;
                  auVar158._8_4_ = auVar157._8_4_ + auVar54._8_4_;
                  auVar158._12_4_ = auVar157._12_4_ + auVar54._12_4_;
                  auVar54 = vhaddps_avx(auVar158,auVar158);
                }
                if (bVar10) {
                  in_ZMM18 = vmulps_avx512f(in_ZMM21,auVar65);
                  auVar61 = in_ZMM18._32_32_;
                }
                else {
                  auVar58 = vxorps_avx512vl(auVar58,auVar58);
                  in_ZMM18 = ZEXT1664(auVar58);
                }
                auVar101._0_32_ = vextractf64x4_avx512f(in_ZMM21,1);
                auVar101._32_32_ = auVar61;
                in_ZMM22 = ZEXT3264(auVar101._0_32_);
                auVar60 = in_ZMM21._0_32_;
                auVar68 = auVar101;
                if (bVar8) {
                  auVar61 = vaddps_avx512vl(auVar60,in_ZMM23._0_32_);
                  auVar61 = vaddps_avx512vl(auVar61,auVar101._0_32_);
                  in_ZMM23 = ZEXT3264(auVar61);
                  auVar61 = vmulps_avx512vl(auVar61,auVar65._0_32_);
                  auVar68 = vinsertf64x4_avx512f(in_ZMM18,auVar61,0);
                  in_ZMM18 = auVar68;
                }
                if (bVar6) {
                  auVar61 = vaddps_avx512vl(auVar60,in_ZMM23._0_32_);
                  auVar61 = vaddps_avx512vl(auVar61,auVar101._0_32_);
                  in_ZMM23 = ZEXT3264(auVar61);
                  auVar58 = vextractf32x4_avx512vl(auVar61,1);
                  auVar58 = vaddps_avx512vl(auVar61._0_16_,auVar58);
                  auVar57 = vaddps_avx512vl(auVar58,auVar57);
                  auVar58 = vmulps_avx512vl(auVar57,auVar65._0_16_);
                  auVar68 = vinsertf32x4_avx512f(in_ZMM18,auVar58,0);
                  in_ZMM18 = auVar68;
                }
                in_ZMM24 = ZEXT1664(auVar57);
                if (bVar9) {
                  auVar102._32_32_ = auVar68._32_32_;
                  auVar102._0_32_ = vaddps_avx512vl(auVar60,auVar101._0_32_);
                  auVar104._16_48_ = auVar102._16_48_;
                  auVar58 = vextractf32x4_avx512vl(auVar102._0_32_,1);
                  auVar58 = vaddps_avx512vl(auVar102._0_16_,auVar58);
                  auVar55 = vshufpd_avx512vl(auVar58,auVar58,1);
                  auVar59 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
                  auVar59 = vaddps_avx512vl(auVar59,in_ZMM23._0_16_);
                  auVar56 = vshufps_avx512vl(auVar59,auVar57,0x11);
                  auVar57 = vshufps_avx512vl(auVar59,auVar57,0xbb);
                  auVar57 = vaddps_avx512vl(auVar57,auVar56);
                  in_ZMM22 = ZEXT1664(auVar57);
                  auVar59 = vshufpd_avx512vl(auVar57,auVar57,1);
                  in_ZMM23 = ZEXT1664(auVar59);
                  auVar57 = vaddps_avx512vl(auVar57,auVar59);
                  auVar57 = vhaddps_avx(auVar57,auVar57);
                  auVar58 = vaddps_avx512vl(auVar55,auVar58);
                  auVar55 = vmovshdup_avx512vl(auVar58);
                  in_ZMM21 = ZEXT1664(auVar55);
                  auVar54 = vaddss_avx512f(auVar55,auVar54);
                  auVar104._0_16_ = in_ZMM18._0_16_;
                  auVar103._4_60_ = auVar104._4_60_;
                  auVar103._0_4_ = (auVar58._0_4_ + auVar54._0_4_ + auVar57._0_4_) * fVar130;
                  auVar68 = vinsertf32x4_avx512f(in_ZMM18,auVar103._0_16_,0);
                  in_ZMM18 = auVar68;
                }
                auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
                if (iVar36 < 8) {
                  auVar106._16_48_ = auVar68._16_48_;
                  auVar57 = in_ZMM18._0_16_;
                  if (iVar36 == 1) {
                    auVar58 = vaddss_avx512f(auVar57,auVar54);
                    auVar54 = vrsqrtss_avx(auVar58,auVar58);
                    auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar54._0_4_)),
                                                  auVar54,ZEXT416(0xc0400000));
                    auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
                    fVar176 = auVar54._0_4_ * auVar58._0_4_;
                    auVar106._0_16_ = auVar57;
                    auVar105._4_60_ = auVar106._4_60_;
                    auVar105._0_4_ = fVar176;
                    in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar105._0_16_,0);
                    auVar108._16_48_ = in_ZMM18._16_48_;
                    auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar181);
                    auVar108._0_16_ = in_ZMM17._0_16_;
                    auVar107._4_60_ = auVar108._4_60_;
                    auVar107._0_4_ = fVar176 * auVar54._0_4_;
                    auVar68 = vinsertf32x4_avx512f(in_ZMM17,auVar107._0_16_,0);
                    in_ZMM17 = auVar68;
                  }
                  else if (iVar36 == 4) {
                    auVar54 = vbroadcastss_avx512vl(auVar54);
                    auVar57 = vaddps_avx512vl(auVar57,auVar54);
                    auVar54 = vrsqrtps_avx(auVar57);
                    auVar159._0_4_ = auVar57._0_4_ * auVar54._0_4_;
                    auVar159._4_4_ = auVar57._4_4_ * auVar54._4_4_;
                    auVar159._8_4_ = auVar57._8_4_ * auVar54._8_4_;
                    auVar159._12_4_ = auVar57._12_4_ * auVar54._12_4_;
                    auVar57 = vfmadd213ps_fma(auVar159,auVar54,auVar184);
                    auVar160._0_4_ = auVar54._0_4_ * -0.5 * auVar57._0_4_;
                    auVar160._4_4_ = auVar54._4_4_ * -0.5 * auVar57._4_4_;
                    auVar160._8_4_ = auVar54._8_4_ * -0.5 * auVar57._8_4_;
                    auVar160._12_4_ = auVar54._12_4_ * -0.5 * auVar57._12_4_;
                    auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar181);
                    auVar178._0_4_ = auVar160._0_4_ * auVar54._0_4_;
                    auVar178._4_4_ = auVar160._4_4_ * auVar54._4_4_;
                    auVar178._8_4_ = auVar160._8_4_ * auVar54._8_4_;
                    auVar178._12_4_ = auVar160._12_4_ * auVar54._12_4_;
                    in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar160,0);
                    auVar68 = vinsertf32x4_avx512f(in_ZMM17,auVar178,0);
                    in_ZMM17 = auVar68;
                  }
                }
                else if (iVar36 == 8) {
                  auVar60 = vbroadcastss_avx512vl(auVar54);
                  auVar61 = vaddps_avx512vl(in_ZMM18._0_32_,auVar60);
                  auVar60 = vrsqrtps_avx(auVar61);
                  auVar34._4_4_ = auVar61._4_4_ * auVar60._4_4_;
                  auVar34._0_4_ = auVar61._0_4_ * auVar60._0_4_;
                  auVar34._8_4_ = auVar61._8_4_ * auVar60._8_4_;
                  auVar34._12_4_ = auVar61._12_4_ * auVar60._12_4_;
                  auVar34._16_4_ = auVar61._16_4_ * auVar60._16_4_;
                  auVar34._20_4_ = auVar61._20_4_ * auVar60._20_4_;
                  auVar34._24_4_ = auVar61._24_4_ * auVar60._24_4_;
                  auVar34._28_4_ = auVar61._28_4_;
                  auVar54 = vfmadd213ps_fma(auVar34,auVar60,auVar187);
                  auVar172._0_4_ = auVar60._0_4_ * -0.5 * auVar54._0_4_;
                  auVar172._4_4_ = auVar60._4_4_ * -0.5 * auVar54._4_4_;
                  auVar172._8_4_ = auVar60._8_4_ * -0.5 * auVar54._8_4_;
                  auVar172._12_4_ = auVar60._12_4_ * -0.5 * auVar54._12_4_;
                  auVar172._16_4_ = auVar60._16_4_ * -0.5 * 0.0;
                  auVar172._20_4_ = auVar60._20_4_ * -0.5 * 0.0;
                  auVar172._24_4_ = auVar60._24_4_ * -0.5 * 0.0;
                  auVar172._28_4_ = 0;
                  auVar60 = vxorps_avx512vl(in_ZMM17._0_32_,auVar189);
                  auVar35._4_4_ = auVar172._4_4_ * auVar60._4_4_;
                  auVar35._0_4_ = auVar172._0_4_ * auVar60._0_4_;
                  auVar35._8_4_ = auVar172._8_4_ * auVar60._8_4_;
                  auVar35._12_4_ = auVar172._12_4_ * auVar60._12_4_;
                  auVar35._16_4_ = auVar172._16_4_ * auVar60._16_4_;
                  auVar35._20_4_ = auVar172._20_4_ * auVar60._20_4_;
                  auVar35._24_4_ = auVar172._24_4_ * auVar60._24_4_;
                  auVar35._28_4_ = auVar60._28_4_;
                  in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar172,0);
                  auVar68 = vinsertf64x4_avx512f(in_ZMM17,auVar35,0);
                  in_ZMM17 = auVar68;
                }
                else if (iVar36 == 0x10) {
                  auVar68 = vbroadcastss_avx512f(auVar54);
                  auVar68 = vaddps_avx512f(in_ZMM18,auVar68);
                  auVar191 = vrsqrt14ps_avx512f(auVar68);
                  auVar68 = vmulps_avx512f(auVar68,auVar191);
                  auVar68 = vfmadd213ps_avx512f(auVar68,auVar191,auVar69);
                  auVar191 = vmulps_avx512f(auVar191,auVar70);
                  in_ZMM18 = vmulps_avx512f(auVar191,auVar68);
                  auVar68 = vxorps_avx512dq(in_ZMM17,auVar190);
                  auVar68 = vmulps_avx512f(in_ZMM18,auVar68);
                  in_ZMM17 = auVar68;
                }
                auVar57 = in_ZMM18._0_16_;
                auVar61 = in_ZMM18._0_32_;
                auVar54 = in_ZMM17._0_16_;
                auVar60 = in_ZMM17._0_32_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
                  auVar58 = auVar54;
                  auVar55 = auVar57;
                  if (!bVar6) {
                    auVar55 = vbroadcastss_avx512vl(auVar57);
                    auVar58 = vbroadcastss_avx512vl(auVar54);
                  }
                  in_ZMM20 = ZEXT1664(auVar58);
                  in_ZMM19 = ZEXT1664(auVar55);
                  if (!bVar8) {
                    auVar61 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
                    auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
                  }
                  in_ZMM21 = ZEXT3264(auVar60);
                  in_ZMM23 = in_ZMM17;
                  in_ZMM22 = in_ZMM18;
                  if (!bVar10) {
                    in_ZMM22 = vinsertf64x4_avx512f(ZEXT3264(auVar61),auVar61,1);
                    in_ZMM23 = vinsertf64x4_avx512f(in_ZMM21,auVar60,1);
                  }
                  auVar68 = in_ZMM23;
                  uVar39 = 0;
                  if (0xf < (int)uVar45) {
                    iVar38 = 0x10;
                    do {
                      auVar68 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,in_ZMM22);
                      *pauVar49 = auVar68;
                      pauVar49 = pauVar49 + 1;
                      iVar38 = iVar38 + 0x10;
                      uVar39 = uVar52;
                    } while (iVar38 <= (int)uVar45);
                  }
                  uVar41 = uVar39 | 8;
                  while ((int)uVar41 <= (int)uVar45) {
                    auVar68._0_32_ =
                         vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar60,auVar61);
                    *(undefined1 (*) [32])*pauVar49 = auVar68._0_32_;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                    uVar41 = uVar39 + 0x10;
                    uVar39 = uVar39 + 8;
                  }
                  iVar38 = uVar39 + 4;
                  while (iVar38 <= (int)uVar45) {
                    auVar68._0_16_ =
                         vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar58,auVar55);
                    *(undefined1 (*) [16])*pauVar49 = auVar68._0_16_;
                    pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                    iVar38 = uVar39 + 8;
                    uVar39 = uVar39 + 4;
                  }
                  if ((int)uVar39 < (int)uVar45) {
                    auVar191 = vpbroadcastq_avx512f();
                    in_ZMM18 = vbroadcastss_avx512f(auVar57);
                    in_ZMM17 = vbroadcastss_avx512f(auVar54);
                    uVar46 = 0;
                    do {
                      auVar68 = vpbroadcastq_avx512f();
                      auVar72 = vporq_avx512f(auVar68,auVar66);
                      auVar68 = vporq_avx512f(auVar68,auVar67);
                      uVar19 = vpcmpuq_avx512f(auVar68,auVar191,2);
                      bVar30 = (byte)uVar19;
                      uVar19 = vpcmpuq_avx512f(auVar72,auVar191,2);
                      bVar31 = (byte)uVar19;
                      uVar53 = CONCAT11(bVar31,bVar30);
                      piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                      auVar111._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                      auVar111._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                      auVar111._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                      auVar111._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                      auVar111._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                      auVar111._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                      auVar111._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                      auVar111._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                      auVar111._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                      auVar111._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                      auVar111._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                      auVar111._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                      auVar111._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                      auVar111._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                      auVar111._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                      auVar111._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                      auVar73 = vfmadd213ps_avx512f(auVar111,in_ZMM18,in_ZMM17);
                      auVar72 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                      auVar68._0_4_ =
                           (uint)(bVar30 & 1) * auVar73._0_4_ |
                           (uint)!(bool)(bVar30 & 1) * auVar72._0_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                      auVar68._4_4_ = (uint)bVar6 * auVar73._4_4_ | (uint)!bVar6 * auVar72._4_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                      auVar68._8_4_ = (uint)bVar6 * auVar73._8_4_ | (uint)!bVar6 * auVar72._8_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                      auVar68._12_4_ = (uint)bVar6 * auVar73._12_4_ | (uint)!bVar6 * auVar72._12_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                      auVar68._16_4_ = (uint)bVar6 * auVar73._16_4_ | (uint)!bVar6 * auVar72._16_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                      auVar68._20_4_ = (uint)bVar6 * auVar73._20_4_ | (uint)!bVar6 * auVar72._20_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                      auVar68._24_4_ = (uint)bVar6 * auVar73._24_4_ | (uint)!bVar6 * auVar72._24_4_;
                      bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                      auVar68._28_4_ = (uint)bVar6 * auVar73._28_4_ | (uint)!bVar6 * auVar72._28_4_;
                      auVar68._32_4_ =
                           (uint)(bVar31 & 1) * auVar73._32_4_ |
                           (uint)!(bool)(bVar31 & 1) * auVar72._32_4_;
                      bVar6 = (bool)(bVar31 >> 1 & 1);
                      auVar68._36_4_ = (uint)bVar6 * auVar73._36_4_ | (uint)!bVar6 * auVar72._36_4_;
                      bVar6 = (bool)(bVar31 >> 2 & 1);
                      auVar68._40_4_ = (uint)bVar6 * auVar73._40_4_ | (uint)!bVar6 * auVar72._40_4_;
                      bVar6 = (bool)(bVar31 >> 3 & 1);
                      auVar68._44_4_ = (uint)bVar6 * auVar73._44_4_ | (uint)!bVar6 * auVar72._44_4_;
                      bVar6 = (bool)(bVar31 >> 4 & 1);
                      auVar68._48_4_ = (uint)bVar6 * auVar73._48_4_ | (uint)!bVar6 * auVar72._48_4_;
                      bVar6 = (bool)(bVar31 >> 5 & 1);
                      auVar68._52_4_ = (uint)bVar6 * auVar73._52_4_ | (uint)!bVar6 * auVar72._52_4_;
                      bVar6 = (bool)(bVar31 >> 6 & 1);
                      auVar68._56_4_ = (uint)bVar6 * auVar73._56_4_ | (uint)!bVar6 * auVar72._56_4_;
                      auVar68._60_4_ =
                           (uint)(bVar31 >> 7) * auVar73._60_4_ |
                           (uint)!(bool)(bVar31 >> 7) * auVar72._60_4_;
                      *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar68;
                      uVar46 = uVar46 + 0x10;
                    } while (((ulong)(~uVar39 + uVar45) + 0x10 & 0x1fffffff0) != uVar46);
                  }
                }
                else {
                  pauVar37 = pauVar44;
                  pauVar42 = pauVar50;
                  if ((bool)(bVar10 & 0xf < (int)uVar45)) {
                    iVar38 = 0x10;
                    do {
                      auVar68 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar42));
                      auVar191 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar28._4_4_ = uVar3;
                      auVar28._0_4_ = uVar3;
                      auVar28._8_4_ = uVar3;
                      auVar28._12_4_ = uVar3;
                      auVar28._16_4_ = uVar3;
                      auVar28._20_4_ = uVar3;
                      auVar28._24_4_ = uVar3;
                      auVar28._28_4_ = uVar3;
                      auVar28._32_4_ = uVar3;
                      auVar28._36_4_ = uVar3;
                      auVar28._40_4_ = uVar3;
                      auVar28._44_4_ = uVar3;
                      auVar28._48_4_ = uVar3;
                      auVar28._52_4_ = uVar3;
                      auVar28._56_4_ = uVar3;
                      auVar28._60_4_ = uVar3;
                      auVar68 = vfmadd213ps_avx512f(auVar191,auVar68,auVar28);
                      *pauVar49 = auVar68;
                      pauVar49 = pauVar49 + 1;
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                      iVar38 = iVar38 + 0x10;
                    } while (iVar38 <= (int)uVar45);
                  }
                  if (bVar8) {
                    iVar38 = 8;
                    if (0xf < (int)uVar45) {
                      auVar191 = vinsertf64x4_avx512f(in_ZMM18,auVar61,1);
                      in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
                      iVar40 = 0x10;
                      do {
                        in_ZMM21 = ZEXT464(*(uint *)(*pauVar37 + 4));
                        auVar68 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar131,
                                                    ZEXT464(*(uint *)(*pauVar42 + 4)));
                        in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar131,in_ZMM21);
                        auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar191);
                        auVar68 = vfmadd213ps_avx512f(auVar72,auVar68,in_ZMM20);
                        *pauVar49 = auVar68;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        iVar40 = iVar40 + 0x10;
                        iVar38 = uVar52 + 8;
                      } while (iVar40 <= (int)uVar45);
                    }
                    for (; iVar38 <= (int)uVar45; iVar38 = iVar38 + 8) {
                      uVar3 = *(undefined4 *)*pauVar42;
                      auVar173._4_4_ = uVar3;
                      auVar173._0_4_ = uVar3;
                      auVar173._8_4_ = uVar3;
                      auVar173._12_4_ = uVar3;
                      auVar173._16_4_ = uVar3;
                      auVar173._20_4_ = uVar3;
                      auVar173._24_4_ = uVar3;
                      auVar173._28_4_ = uVar3;
                      auVar62 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [32])*pauVar49,auVar60,auVar61);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar25._4_4_ = uVar3;
                      auVar25._0_4_ = uVar3;
                      auVar25._8_4_ = uVar3;
                      auVar25._12_4_ = uVar3;
                      auVar25._16_4_ = uVar3;
                      auVar25._20_4_ = uVar3;
                      auVar25._24_4_ = uVar3;
                      auVar25._28_4_ = uVar3;
                      auVar68._0_32_ = vfmadd213ps_avx512vl(auVar62,auVar173,auVar25);
                      *(undefined1 (*) [32])*pauVar49 = auVar68._0_32_;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                    }
                  }
                  if (bVar6) {
                    uVar39 = 0;
                    if (0xf < (int)uVar45) {
                      auVar68 = vinsertf64x4_avx512f(in_ZMM18,auVar61,1);
                      auVar191 = vpermpd_avx512f(auVar68,0x44);
                      auVar68 = vinsertf64x4_avx512f(in_ZMM17,auVar60,1);
                      in_ZMM19 = vpermpd_avx512f(auVar68,0x44);
                      iVar38 = 0x10;
                      do {
                        auVar68 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                        auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                        auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                                   ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                        auVar62 = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                        auVar68 = vinsertf64x4_avx512f(auVar68,auVar62,0);
                        auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                        in_ZMM21 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                        auVar109._0_48_ = auVar68._0_48_;
                        auVar109._48_8_ = auVar72._48_8_;
                        auVar109._56_8_ = auVar72._56_8_;
                        in_ZMM22 = ZEXT464(*(uint *)(*pauVar37 + 4));
                        auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar62 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                        auVar68 = vinsertf64x4_avx512f(auVar73,auVar62,0);
                        auVar110._0_48_ = auVar68._0_48_;
                        auVar110._48_8_ = in_ZMM21._48_8_;
                        auVar110._56_8_ = in_ZMM21._56_8_;
                        auVar68 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar191);
                        auVar68 = vfmadd213ps_avx512f(auVar68,auVar109,auVar110);
                        *pauVar49 = auVar68;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                        iVar38 = iVar38 + 0x10;
                        in_ZMM20 = auVar68;
                        uVar39 = uVar52;
                      } while (iVar38 <= (int)uVar45);
                    }
                    if ((int)(uVar39 | 8) <= (int)uVar45) {
                      auVar112._32_32_ = auVar68._32_32_;
                      auVar61 = vpermpd_avx512vl(auVar61,0x44);
                      auVar112._0_32_ = vpermpd_avx512vl(auVar60,0x44);
                      in_ZMM19 = ZEXT3264(auVar112._0_32_);
                      auVar68 = auVar112;
                      uVar41 = uVar39;
                      do {
                        auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar42),
                                              ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                        auVar55 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                                   ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                        auVar60 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                        auVar62 = vpermpd_avx2(ZEXT1632(auVar55),0x50);
                        auVar63 = vfmadd132ps_avx512vl
                                            (*(undefined1 (*) [32])*pauVar49,auVar112._0_32_,auVar61
                                            );
                        auVar68._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar60,auVar62);
                        in_ZMM20 = ZEXT3264(auVar68._0_32_);
                        *(undefined1 (*) [32])*pauVar49 = auVar68._0_32_;
                        pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                        pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                        pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                        uVar39 = uVar41 + 8;
                        iVar38 = uVar41 + 0x10;
                        uVar41 = uVar39;
                      } while (iVar38 <= (int)uVar45);
                    }
                    while (uVar39 = uVar39 + 4, (int)uVar39 <= (int)uVar45) {
                      uVar3 = *(undefined4 *)*pauVar42;
                      auVar161._4_4_ = uVar3;
                      auVar161._0_4_ = uVar3;
                      auVar161._8_4_ = uVar3;
                      auVar161._12_4_ = uVar3;
                      auVar58 = vfmadd132ps_avx512vl
                                          (*(undefined1 (*) [16])*pauVar49,auVar54,auVar57);
                      uVar3 = *(undefined4 *)*pauVar37;
                      auVar21._4_4_ = uVar3;
                      auVar21._0_4_ = uVar3;
                      auVar21._8_4_ = uVar3;
                      auVar21._12_4_ = uVar3;
                      auVar68._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar161,auVar21);
                      *(undefined1 (*) [16])*pauVar49 = auVar68._0_16_;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                    }
                  }
                  if (bVar9) {
                    in_ZMM19 = vbroadcastss_avx512f(auVar57);
                    in_ZMM20 = vbroadcastss_avx512f(auVar54);
                    auVar68 = in_ZMM20;
                    uVar39 = 0;
                    if (0xf < (int)uVar45) {
                      iVar38 = 0x10;
                      do {
                        auVar68 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                        auVar68 = vfmadd213ps_avx512f(auVar68,*pauVar42,*pauVar37);
                        *pauVar49 = auVar68;
                        pauVar49 = pauVar49 + 1;
                        pauVar42 = pauVar42 + 1;
                        pauVar37 = pauVar37 + 1;
                        iVar38 = iVar38 + 0x10;
                        uVar39 = uVar52;
                      } while (iVar38 <= (int)uVar45);
                    }
                    uVar41 = uVar39 | 8;
                    while ((int)uVar41 <= (int)uVar45) {
                      auVar68._0_32_ =
                           vfmadd132ps_avx512vl
                                     (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,
                                      in_ZMM19._0_32_);
                      auVar58 = vfmadd213ps_fma(auVar68._0_32_,*(undefined1 (*) [32])*pauVar42,
                                                *(undefined1 (*) [32])*pauVar37);
                      *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                      uVar41 = uVar39 + 0x10;
                      uVar39 = uVar39 + 8;
                    }
                    iVar38 = uVar39 + 4;
                    while (iVar38 <= (int)uVar45) {
                      auVar68._0_16_ =
                           vfmadd132ps_avx512vl
                                     (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,
                                      in_ZMM19._0_16_);
                      auVar58 = vfmadd213ps_fma(auVar68._0_16_,*(undefined1 (*) [16])*pauVar42,
                                                *(undefined1 (*) [16])*pauVar37);
                      *(undefined1 (*) [16])*pauVar49 = auVar58;
                      pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                      pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                      iVar38 = uVar39 + 8;
                      uVar39 = uVar39 + 4;
                    }
                    if (uVar45 - uVar39 != 0 && (int)uVar39 <= (int)uVar45) {
                      lVar47 = 0;
                      do {
                        auVar68._0_16_ =
                             vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                                 auVar57);
                        auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)),
                                                  auVar68._0_16_,
                                                  ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)));
                        *(int *)(*pauVar49 + lVar47 * 4) = auVar58._0_4_;
                        lVar47 = lVar47 + 1;
                      } while (uVar45 - uVar39 != (int)lVar47);
                    }
                  }
                }
                uVar51 = uVar51 + 1;
              } while (uVar51 != uVar43);
            }
            local_48 = local_48 + 1;
          } while (local_48 != uVar48);
        }
      }
      else if (0 < (int)uVar48) {
        uVar52 = uVar43 * iVar40 * iVar36;
        fVar130 = 1.0 / (float)(int)(uVar43 * iVar40);
        auVar65 = vbroadcastss_avx512f(ZEXT416((uint)fVar130));
        uVar43 = uVar52 & 0xfffffff0;
        uVar51 = 0;
        auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar68 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar191._0_16_ = vxorps_avx512vl(auVar54,auVar54);
        auVar182._8_4_ = 0x80000000;
        auVar182._0_8_ = 0x8000000080000000;
        auVar182._12_4_ = 0x80000000;
        auVar185._8_4_ = 0xc0400000;
        auVar185._0_8_ = 0xc0400000c0400000;
        auVar185._12_4_ = 0xc0400000;
        auVar60._8_4_ = 0xc0400000;
        auVar60._0_8_ = 0xc0400000c0400000;
        auVar60._12_4_ = 0xc0400000;
        auVar60._16_4_ = 0xc0400000;
        auVar60._20_4_ = 0xc0400000;
        auVar60._24_4_ = 0xc0400000;
        auVar60._28_4_ = 0xc0400000;
        auVar61._8_4_ = 0x80000000;
        auVar61._0_8_ = 0x8000000080000000;
        auVar61._12_4_ = 0x80000000;
        auVar61._16_4_ = 0x80000000;
        auVar61._20_4_ = 0x80000000;
        auVar61._24_4_ = 0x80000000;
        auVar61._28_4_ = 0x80000000;
        auVar69 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar70 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar190 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar67 = auVar190;
        do {
          auVar58 = in_ZMM17._0_16_;
          auVar57 = in_ZMM22._0_16_;
          pauVar49 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar51 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar129 = auVar67._16_48_;
          auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          auVar67 = ZEXT1664(auVar54);
          pauVar37 = pauVar49;
          uVar45 = 0;
          if (0xf < (int)uVar52) {
            iVar38 = 0x10;
            do {
              auVar67 = vaddps_avx512f(auVar67,*pauVar37);
              auVar129 = auVar67._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar43;
            } while (iVar38 <= (int)uVar52);
          }
          auVar54 = auVar67._0_16_;
          uVar39 = uVar45 | 8;
          auVar73._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
          auVar73._16_48_ = auVar129;
          auVar72 = ZEXT1664(auVar73._0_16_);
          auVar62 = auVar129._16_32_;
          auVar63 = ZEXT1632(auVar73._0_16_);
          while ((int)uVar39 <= (int)uVar52) {
            auVar73._0_32_ = vaddps_avx512vl(auVar72._0_32_,*(undefined1 (*) [32])*pauVar37);
            auVar72 = ZEXT3264(auVar73._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
            auVar62 = auVar73._32_32_;
            auVar63 = auVar73._0_32_;
          }
          auVar59 = auVar63._0_16_;
          iVar38 = uVar45 + 4;
          auVar55 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
          while (iVar38 <= (int)uVar52) {
            auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          auVar56 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          in_ZMM19 = ZEXT1664(auVar56);
          auVar56 = ZEXT816(0) << 0x40;
          if ((int)uVar45 < (int)uVar52) {
            auVar73 = vpbroadcastq_avx512f();
            auVar57 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
            uVar46 = 0;
            auVar72 = ZEXT1664(auVar57);
            do {
              auVar114 = auVar72;
              auVar72 = vpbroadcastq_avx512f();
              auVar113 = vporq_avx512f(auVar72,auVar66);
              auVar57 = auVar113._0_16_;
              auVar72 = vporq_avx512f(auVar72,auVar68);
              uVar19 = vpcmpuq_avx512f(auVar72,auVar73,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar113,auVar73,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar46 * 4);
              auVar72._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar72._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar72._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar72._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar72._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar72._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar72._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar72._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar72._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar72._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar72._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar72._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar72._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar72._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar72._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar72._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar72 = vaddps_avx512f(auVar72,auVar114);
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            auVar113._0_4_ =
                 (uint)(bVar30 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar114._0_4_;
            bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar6 * auVar72._4_4_ | (uint)!bVar6 * auVar114._4_4_;
            bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar6 * auVar72._8_4_ | (uint)!bVar6 * auVar114._8_4_;
            bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar6 * auVar72._12_4_ | (uint)!bVar6 * auVar114._12_4_;
            bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
            auVar113._16_4_ = (uint)bVar6 * auVar72._16_4_ | (uint)!bVar6 * auVar114._16_4_;
            bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
            auVar113._20_4_ = (uint)bVar6 * auVar72._20_4_ | (uint)!bVar6 * auVar114._20_4_;
            bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
            auVar113._24_4_ = (uint)bVar6 * auVar72._24_4_ | (uint)!bVar6 * auVar114._24_4_;
            bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
            auVar113._28_4_ = (uint)bVar6 * auVar72._28_4_ | (uint)!bVar6 * auVar114._28_4_;
            auVar113._32_4_ =
                 (uint)(bVar31 & 1) * auVar72._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar114._32_4_;
            bVar6 = (bool)(bVar31 >> 1 & 1);
            auVar113._36_4_ = (uint)bVar6 * auVar72._36_4_ | (uint)!bVar6 * auVar114._36_4_;
            bVar6 = (bool)(bVar31 >> 2 & 1);
            auVar113._40_4_ = (uint)bVar6 * auVar72._40_4_ | (uint)!bVar6 * auVar114._40_4_;
            bVar6 = (bool)(bVar31 >> 3 & 1);
            auVar113._44_4_ = (uint)bVar6 * auVar72._44_4_ | (uint)!bVar6 * auVar114._44_4_;
            bVar6 = (bool)(bVar31 >> 4 & 1);
            auVar113._48_4_ = (uint)bVar6 * auVar72._48_4_ | (uint)!bVar6 * auVar114._48_4_;
            bVar6 = (bool)(bVar31 >> 5 & 1);
            auVar113._52_4_ = (uint)bVar6 * auVar72._52_4_ | (uint)!bVar6 * auVar114._52_4_;
            bVar6 = (bool)(bVar31 >> 6 & 1);
            auVar113._56_4_ = (uint)bVar6 * auVar72._56_4_ | (uint)!bVar6 * auVar114._56_4_;
            auVar113._60_4_ =
                 (uint)(bVar31 >> 7) * auVar72._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar114._60_4_
            ;
            auVar62 = vextractf64x4_avx512f(auVar113,1);
            auVar72 = vaddps_avx512f(auVar113,ZEXT3264(auVar62));
            auVar58 = vextractf32x4_avx512vl(auVar72._0_32_,1);
            auVar56 = vaddps_avx512vl(auVar72._0_16_,auVar58);
            auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
            auVar56 = vaddps_avx512vl(auVar56,auVar58);
            auVar62 = auVar72._32_32_;
            auVar56 = vhaddps_avx(auVar56,auVar56);
          }
          in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          auVar57 = vpxord_avx512vl(auVar57,auVar57);
          in_ZMM22 = ZEXT1664(auVar57);
          auVar57 = vxorps_avx512vl(auVar58,auVar58);
          in_ZMM17 = ZEXT1664(auVar57);
          auVar57 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
          bVar6 = false;
          auVar114._0_32_ = auVar67._0_32_;
          auVar72 = ZEXT1664(auVar57);
          if (iVar36 < 8) {
            if (iVar36 == 1) {
              auVar64 = vextractf64x4_avx512f(auVar67,1);
              auVar114._0_32_ = vaddps_avx512vl(auVar114._0_32_,auVar64);
              auVar54 = vextractf32x4_avx512vl(auVar114._0_32_,1);
              auVar54 = vaddps_avx512vl(auVar114._0_16_,auVar54);
              auVar58 = vshufpd_avx512vl(auVar54,auVar54,1);
              auVar57 = vextractf32x4_avx512vl(auVar63,1);
              auVar57 = vaddps_avx512vl(auVar57,auVar59);
              auVar59 = vshufps_avx512vl(auVar55,auVar57,0x11);
              auVar57 = vshufps_avx512vl(auVar55,auVar57,0xbb);
              auVar57 = vaddps_avx512vl(auVar57,auVar59);
              auVar59 = vshufpd_avx512vl(auVar57,auVar57,1);
              auVar57 = vaddps_avx512vl(auVar57,auVar59);
              auVar57 = vhaddps_avx(auVar57,auVar57);
              auVar58 = vaddps_avx512vl(auVar58,auVar54);
              auVar54 = vmovshdup_avx512vl(auVar58);
              auVar56 = vaddss_avx512f(auVar54,auVar56);
              auVar58 = vaddss_avx512f(auVar58,auVar56);
              auVar57 = vmulss_avx512f(ZEXT416((uint)(auVar58._0_4_ + auVar57._0_4_)),
                                       ZEXT416((uint)fVar130));
              in_ZMM19 = ZEXT1664(auVar57);
              auVar114._0_32_ = vbroadcastss_avx512vl(auVar57);
              auVar114._32_32_ = auVar62;
              auVar191._16_48_ = auVar114._16_48_;
              auVar115._4_60_ = auVar191._4_60_;
              auVar115._0_4_ = auVar114._0_4_;
              in_ZMM17 = ZEXT1664(auVar115._0_16_);
              bVar9 = true;
              bVar6 = false;
              auVar57 = auVar114._0_16_;
            }
            else {
              bVar9 = false;
              bVar8 = false;
              if (iVar36 != 4) goto LAB_004d6383;
              auVar62 = vextractf64x4_avx512f(auVar67,1);
              auVar63 = vaddps_avx512vl(auVar114._0_32_,auVar63);
              fVar176 = auVar63._4_4_ + auVar62._4_4_;
              auVar162._0_4_ = auVar63._16_4_ + auVar62._16_4_ + auVar63._0_4_ + auVar62._0_4_;
              auVar162._4_4_ = fVar176 + fVar176;
              auVar162._8_4_ = auVar63._24_4_ + auVar62._24_4_ + auVar63._8_4_ + auVar62._8_4_;
              auVar162._12_4_ = auVar63._28_4_ + auVar62._28_4_ + auVar63._12_4_ + auVar62._12_4_;
              auVar57 = vaddps_avx512vl(auVar162,auVar55);
              auVar57 = vmulps_avx512vl(auVar57,auVar65._0_16_);
              in_ZMM17 = ZEXT1664(auVar57);
              auVar114._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
              bVar6 = true;
              bVar9 = false;
              in_ZMM19 = in_ZMM17;
            }
            in_ZMM22 = ZEXT1664(auVar57);
            bVar8 = false;
            auVar72 = ZEXT3264(auVar114._0_32_);
LAB_004d6383:
            auVar62 = auVar72._0_32_;
            auVar67 = vinsertf64x4_avx512f(auVar72,auVar62,1);
            bVar10 = false;
          }
          else {
            if (iVar36 == 8) {
              auVar62 = vextractf64x4_avx512f(auVar67,1);
              auVar63 = vaddps_avx512vl(auVar114._0_32_,auVar63);
              auVar64._0_4_ = auVar63._0_4_ + auVar62._0_4_;
              auVar64._4_4_ = auVar63._4_4_ + auVar62._4_4_;
              auVar64._8_4_ = auVar63._8_4_ + auVar62._8_4_;
              auVar64._12_4_ = auVar63._12_4_ + auVar62._12_4_;
              auVar64._16_4_ = auVar63._16_4_ + auVar62._16_4_;
              auVar64._20_4_ = auVar63._20_4_ + auVar62._20_4_;
              auVar64._24_4_ = auVar63._24_4_ + auVar62._24_4_;
              auVar64._28_4_ = auVar63._28_4_ + auVar62._28_4_;
              auVar62 = vmulps_avx512vl(auVar64,auVar65._0_32_);
              in_ZMM17 = ZEXT3264(auVar62);
              auVar57 = vbroadcastss_avx512vl(auVar62._0_16_);
              in_ZMM22 = ZEXT1664(auVar57);
              bVar8 = true;
              bVar6 = false;
              in_ZMM19 = ZEXT1664(auVar62._0_16_);
              bVar9 = false;
              auVar72 = in_ZMM17;
              goto LAB_004d6383;
            }
            bVar9 = false;
            bVar8 = false;
            if (iVar36 != 0x10) goto LAB_004d6383;
            auVar67 = vmulps_avx512f(auVar67,auVar65);
            auVar62 = vbroadcastss_avx512vl(auVar67._0_16_);
            bVar10 = true;
            bVar6 = false;
            bVar9 = false;
            in_ZMM22 = ZEXT1664(auVar62._0_16_);
            bVar8 = false;
            in_ZMM17 = auVar67;
            in_ZMM19 = auVar67;
          }
          auVar129 = auVar67._16_48_;
          pauVar37 = pauVar49;
          if ((int)uVar52 < 0x10) {
            auVar57 = vxorps_avx512vl(auVar59,auVar59);
            in_ZMM21 = ZEXT1664(auVar57);
            uVar45 = 0;
          }
          else {
            auVar57 = vxorps_avx512vl(auVar59,auVar59);
            in_ZMM21 = ZEXT1664(auVar57);
            iVar38 = 0x10;
            do {
              auVar72 = vsubps_avx512f(*pauVar37,auVar67);
              in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar72,auVar72);
              auVar129 = in_ZMM21._16_48_;
              pauVar37 = pauVar37 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar43;
            } while (iVar38 <= (int)uVar52);
          }
          uVar39 = uVar45 | 8;
          auVar116._0_16_ = vxorps_avx512vl(auVar55,auVar55);
          auVar116._16_48_ = auVar129;
          in_ZMM23 = ZEXT1664(auVar116._0_16_);
          while ((int)uVar39 <= (int)uVar52) {
            auVar63 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar62);
            auVar116._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar63,auVar63);
            auVar129 = auVar116._16_48_;
            in_ZMM23 = ZEXT3264(auVar116._0_32_);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
          }
          iVar38 = uVar45 + 4;
          auVar57 = vxorps_avx512vl(auVar62._0_16_,auVar62._0_16_);
          while (iVar38 <= (int)uVar52) {
            auVar58 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,in_ZMM22._0_16_);
            auVar57 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar58);
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          auVar58 = ZEXT816(0) << 0x40;
          if ((int)uVar45 < (int)uVar52) {
            auVar67 = vpbroadcastq_avx512f();
            auVar72 = vbroadcastss_avx512f(in_ZMM19._0_16_);
            auVar54 = auVar72._0_16_;
            auVar58 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
            uVar46 = 0;
            in_ZMM26 = ZEXT1664(auVar58);
            do {
              auVar114 = in_ZMM26;
              auVar73 = vpbroadcastq_avx512f();
              auVar113 = vporq_avx512f(auVar73,auVar66);
              auVar73 = vporq_avx512f(auVar73,auVar68);
              uVar19 = vpcmpuq_avx512f(auVar73,auVar67,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar113,auVar67,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar37 + uVar46 * 4);
              auVar117._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar117._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar117._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar117._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar117._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar117._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar117._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar117._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar117._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar117._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar117._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar117._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar117._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar117._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar117._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar117._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar73 = vsubps_avx512f(auVar117,auVar72);
              in_ZMM26 = vfmadd213ps_avx512f(auVar73,auVar73,auVar114);
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            in_ZMM22._0_4_ =
                 (uint)(bVar30 & 1) * in_ZMM26._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar114._0_4_;
            bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
            in_ZMM22._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar114._4_4_;
            bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
            in_ZMM22._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar114._8_4_;
            bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
            in_ZMM22._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar114._12_4_;
            bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
            in_ZMM22._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar114._16_4_;
            bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
            in_ZMM22._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar114._20_4_;
            bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
            in_ZMM22._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar114._24_4_;
            bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
            in_ZMM22._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar114._28_4_;
            in_ZMM22._32_4_ =
                 (uint)(bVar31 & 1) * in_ZMM26._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar114._32_4_;
            bVar7 = (bool)(bVar31 >> 1 & 1);
            in_ZMM22._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar114._36_4_;
            bVar7 = (bool)(bVar31 >> 2 & 1);
            in_ZMM22._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar114._40_4_;
            bVar7 = (bool)(bVar31 >> 3 & 1);
            in_ZMM22._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar114._44_4_;
            bVar7 = (bool)(bVar31 >> 4 & 1);
            in_ZMM22._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar114._48_4_;
            bVar7 = (bool)(bVar31 >> 5 & 1);
            in_ZMM22._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar114._52_4_;
            bVar7 = (bool)(bVar31 >> 6 & 1);
            in_ZMM22._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar114._56_4_;
            in_ZMM22._60_4_ =
                 (uint)(bVar31 >> 7) * in_ZMM26._60_4_ |
                 (uint)!(bool)(bVar31 >> 7) * auVar114._60_4_;
            auVar62 = vextractf64x4_avx512f(in_ZMM22,1);
            auVar67 = vaddps_avx512f(in_ZMM22,ZEXT3264(auVar62));
            auVar129 = auVar67._16_48_;
            auVar163._0_4_ = auVar67._0_4_ + auVar67._16_4_;
            auVar163._4_4_ = auVar67._4_4_ + auVar67._20_4_;
            auVar163._8_4_ = auVar67._8_4_ + auVar67._24_4_;
            auVar163._12_4_ = auVar67._12_4_ + auVar67._28_4_;
            auVar58 = vshufpd_avx(auVar163,auVar163,1);
            auVar164._0_4_ = auVar163._0_4_ + auVar58._0_4_;
            auVar164._4_4_ = auVar163._4_4_ + auVar58._4_4_;
            auVar164._8_4_ = auVar163._8_4_ + auVar58._8_4_;
            auVar164._12_4_ = auVar163._12_4_ + auVar58._12_4_;
            auVar58 = vhaddps_avx(auVar164,auVar164);
          }
          if (bVar10) {
            auVar67 = vmulps_avx512f(in_ZMM21,auVar65);
            in_ZMM18 = auVar67;
          }
          else {
            auVar67._0_16_ = vxorps_avx512vl(auVar54,auVar54);
            auVar67._16_48_ = auVar129;
            in_ZMM18 = ZEXT1664(auVar67._0_16_);
          }
          auVar62 = in_ZMM21._0_32_;
          if (bVar8) {
            auVar63 = vextractf64x4_avx512f(in_ZMM21,1);
            auVar114._0_32_ = vaddps_avx512vl(auVar62,in_ZMM23._0_32_);
            in_ZMM22 = ZEXT3264(auVar114._0_32_);
            auVar63 = vaddps_avx512vl(auVar114._0_32_,auVar63);
            in_ZMM23 = ZEXT3264(auVar63);
            auVar63 = vmulps_avx512vl(auVar63,auVar65._0_32_);
            auVar67 = vinsertf64x4_avx512f(in_ZMM18,auVar63,0);
            in_ZMM18 = auVar67;
          }
          if (bVar6) {
            auVar63 = vextractf64x4_avx512f(in_ZMM21,1);
            auVar114._0_32_ = vaddps_avx512vl(auVar62,in_ZMM23._0_32_);
            in_ZMM22 = ZEXT3264(auVar114._0_32_);
            auVar63 = vaddps_avx512vl(auVar114._0_32_,auVar63);
            in_ZMM23 = ZEXT3264(auVar63);
            auVar54 = vextractf32x4_avx512vl(auVar63,1);
            auVar54 = vaddps_avx512vl(auVar63._0_16_,auVar54);
            auVar57 = vaddps_avx512vl(auVar54,auVar57);
            auVar54 = vmulps_avx512vl(auVar57,auVar65._0_16_);
            auVar67 = vinsertf32x4_avx512f(in_ZMM18,auVar54,0);
            in_ZMM18 = auVar67;
          }
          in_ZMM24 = ZEXT1664(auVar57);
          if (bVar9) {
            auVar118._32_32_ = auVar67._32_32_;
            auVar63 = vextractf64x4_avx512f(in_ZMM21,1);
            auVar118._0_32_ = vaddps_avx512vl(auVar62,auVar63);
            auVar120._16_48_ = auVar118._16_48_;
            auVar54 = vextractf32x4_avx512vl(auVar118._0_32_,1);
            auVar55 = vaddps_avx512vl(auVar118._0_16_,auVar54);
            auVar59 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar54 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
            auVar54 = vaddps_avx512vl(auVar54,in_ZMM23._0_16_);
            auVar56 = vshufps_avx512vl(auVar54,auVar57,0x11);
            auVar54 = vshufps_avx512vl(auVar54,auVar57,0xbb);
            auVar54 = vaddps_avx512vl(auVar54,auVar56);
            in_ZMM22 = ZEXT1664(auVar54);
            auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
            in_ZMM23 = ZEXT1664(auVar57);
            auVar54 = vaddps_avx512vl(auVar54,auVar57);
            auVar54 = vhaddps_avx(auVar54,auVar54);
            auVar57 = vaddps_avx512vl(auVar59,auVar55);
            auVar55 = vmovshdup_avx512vl(auVar57);
            in_ZMM21 = ZEXT1664(auVar55);
            auVar58 = vaddss_avx512f(auVar55,auVar58);
            auVar120._0_16_ = in_ZMM18._0_16_;
            auVar119._4_60_ = auVar120._4_60_;
            auVar119._0_4_ = (auVar57._0_4_ + auVar58._0_4_ + auVar54._0_4_) * fVar130;
            auVar67 = vinsertf32x4_avx512f(in_ZMM18,auVar119._0_16_,0);
            in_ZMM18 = auVar67;
          }
          auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
          if (iVar36 < 8) {
            auVar122._16_48_ = auVar67._16_48_;
            auVar57 = in_ZMM18._0_16_;
            if (iVar36 == 1) {
              auVar58 = vaddss_avx512f(auVar57,auVar54);
              auVar54 = vrsqrtss_avx(auVar58,auVar58);
              auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar54._0_4_)),auVar54,
                                            ZEXT416(0xc0400000));
              auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
              fVar176 = auVar54._0_4_ * auVar58._0_4_;
              auVar122._0_16_ = auVar57;
              auVar121._4_60_ = auVar122._4_60_;
              auVar121._0_4_ = fVar176;
              in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar121._0_16_,0);
              auVar124._16_48_ = in_ZMM18._16_48_;
              auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar182);
              auVar124._0_16_ = in_ZMM17._0_16_;
              auVar123._4_60_ = auVar124._4_60_;
              auVar123._0_4_ = fVar176 * auVar54._0_4_;
              auVar67 = vinsertf32x4_avx512f(in_ZMM17,auVar123._0_16_,0);
              in_ZMM17 = auVar67;
            }
            else if (iVar36 == 4) {
              auVar54 = vbroadcastss_avx512vl(auVar54);
              auVar57 = vaddps_avx512vl(auVar57,auVar54);
              auVar54 = vrsqrtps_avx(auVar57);
              auVar165._0_4_ = auVar57._0_4_ * auVar54._0_4_;
              auVar165._4_4_ = auVar57._4_4_ * auVar54._4_4_;
              auVar165._8_4_ = auVar57._8_4_ * auVar54._8_4_;
              auVar165._12_4_ = auVar57._12_4_ * auVar54._12_4_;
              auVar57 = vfmadd213ps_fma(auVar165,auVar54,auVar185);
              auVar166._0_4_ = auVar54._0_4_ * -0.5 * auVar57._0_4_;
              auVar166._4_4_ = auVar54._4_4_ * -0.5 * auVar57._4_4_;
              auVar166._8_4_ = auVar54._8_4_ * -0.5 * auVar57._8_4_;
              auVar166._12_4_ = auVar54._12_4_ * -0.5 * auVar57._12_4_;
              auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar182);
              auVar179._0_4_ = auVar166._0_4_ * auVar54._0_4_;
              auVar179._4_4_ = auVar166._4_4_ * auVar54._4_4_;
              auVar179._8_4_ = auVar166._8_4_ * auVar54._8_4_;
              auVar179._12_4_ = auVar166._12_4_ * auVar54._12_4_;
              in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar166,0);
              auVar67 = vinsertf32x4_avx512f(in_ZMM17,auVar179,0);
              in_ZMM17 = auVar67;
            }
          }
          else if (iVar36 == 8) {
            auVar62 = vbroadcastss_avx512vl(auVar54);
            auVar114._0_32_ = vaddps_avx512vl(in_ZMM18._0_32_,auVar62);
            auVar62 = vrsqrtps_avx(auVar114._0_32_);
            auVar63._4_4_ = auVar114._4_4_ * auVar62._4_4_;
            auVar63._0_4_ = auVar114._0_4_ * auVar62._0_4_;
            auVar63._8_4_ = auVar114._8_4_ * auVar62._8_4_;
            auVar63._12_4_ = auVar114._12_4_ * auVar62._12_4_;
            auVar63._16_4_ = auVar114._16_4_ * auVar62._16_4_;
            auVar63._20_4_ = auVar114._20_4_ * auVar62._20_4_;
            auVar63._24_4_ = auVar114._24_4_ * auVar62._24_4_;
            auVar63._28_4_ = auVar114._28_4_;
            auVar54 = vfmadd213ps_fma(auVar63,auVar62,auVar60);
            auVar174._0_4_ = auVar62._0_4_ * -0.5 * auVar54._0_4_;
            auVar174._4_4_ = auVar62._4_4_ * -0.5 * auVar54._4_4_;
            auVar174._8_4_ = auVar62._8_4_ * -0.5 * auVar54._8_4_;
            auVar174._12_4_ = auVar62._12_4_ * -0.5 * auVar54._12_4_;
            auVar174._16_4_ = auVar62._16_4_ * -0.5 * 0.0;
            auVar174._20_4_ = auVar62._20_4_ * -0.5 * 0.0;
            auVar174._24_4_ = auVar62._24_4_ * -0.5 * 0.0;
            auVar174._28_4_ = 0;
            auVar63 = vxorps_avx512vl(in_ZMM17._0_32_,auVar61);
            auVar62._4_4_ = auVar174._4_4_ * auVar63._4_4_;
            auVar62._0_4_ = auVar174._0_4_ * auVar63._0_4_;
            auVar62._8_4_ = auVar174._8_4_ * auVar63._8_4_;
            auVar62._12_4_ = auVar174._12_4_ * auVar63._12_4_;
            auVar62._16_4_ = auVar174._16_4_ * auVar63._16_4_;
            auVar62._20_4_ = auVar174._20_4_ * auVar63._20_4_;
            auVar62._24_4_ = auVar174._24_4_ * auVar63._24_4_;
            auVar62._28_4_ = auVar63._28_4_;
            in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar174,0);
            auVar67 = vinsertf64x4_avx512f(in_ZMM17,auVar62,0);
            in_ZMM17 = auVar67;
          }
          else if (iVar36 == 0x10) {
            auVar67 = vbroadcastss_avx512f(auVar54);
            auVar67 = vaddps_avx512f(in_ZMM18,auVar67);
            auVar72 = vrsqrt14ps_avx512f(auVar67);
            auVar67 = vmulps_avx512f(auVar67,auVar72);
            auVar67 = vfmadd213ps_avx512f(auVar67,auVar72,auVar69);
            auVar72 = vmulps_avx512f(auVar72,auVar70);
            in_ZMM18 = vmulps_avx512f(auVar72,auVar67);
            auVar67 = vxorps_avx512dq(in_ZMM17,auVar190);
            auVar67 = vmulps_avx512f(in_ZMM18,auVar67);
            in_ZMM17 = auVar67;
          }
          auVar57 = in_ZMM18._0_16_;
          auVar63 = in_ZMM18._0_32_;
          auVar54 = in_ZMM17._0_16_;
          auVar62 = in_ZMM17._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
            auVar58 = auVar54;
            auVar55 = auVar57;
            if (!bVar6) {
              auVar55 = vbroadcastss_avx512vl(auVar57);
              auVar58 = vbroadcastss_avx512vl(auVar54);
            }
            in_ZMM20 = ZEXT1664(auVar58);
            in_ZMM19 = ZEXT1664(auVar55);
            if (!bVar8) {
              auVar63 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
              auVar62 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
            }
            in_ZMM21 = ZEXT3264(auVar62);
            in_ZMM23 = in_ZMM17;
            in_ZMM22 = in_ZMM18;
            if (!bVar10) {
              in_ZMM22 = vinsertf64x4_avx512f(ZEXT3264(auVar63),auVar63,1);
              in_ZMM23 = vinsertf64x4_avx512f(in_ZMM21,auVar62,1);
            }
            auVar67 = in_ZMM23;
            uVar45 = 0;
            if (0xf < (int)uVar52) {
              iVar38 = 0x10;
              do {
                auVar67 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,in_ZMM22);
                *pauVar49 = auVar67;
                pauVar49 = pauVar49 + 1;
                iVar38 = iVar38 + 0x10;
                uVar45 = uVar43;
              } while (iVar38 <= (int)uVar52);
            }
            uVar39 = uVar45 | 8;
            while ((int)uVar39 <= (int)uVar52) {
              auVar67._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar62,auVar63)
              ;
              *(undefined1 (*) [32])*pauVar49 = auVar67._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              uVar39 = uVar45 + 0x10;
              uVar45 = uVar45 + 8;
            }
            iVar38 = uVar45 + 4;
            while (iVar38 <= (int)uVar52) {
              auVar67._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar58,auVar55)
              ;
              *(undefined1 (*) [16])*pauVar49 = auVar67._0_16_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              iVar38 = uVar45 + 8;
              uVar45 = uVar45 + 4;
            }
            if ((int)uVar45 < (int)uVar52) {
              auVar72 = vpbroadcastq_avx512f();
              in_ZMM18 = vbroadcastss_avx512f(auVar57);
              in_ZMM17 = vbroadcastss_avx512f(auVar54);
              uVar46 = 0;
              do {
                auVar67 = vpbroadcastq_avx512f();
                auVar73 = vporq_avx512f(auVar67,auVar66);
                auVar67 = vporq_avx512f(auVar67,auVar68);
                uVar19 = vpcmpuq_avx512f(auVar67,auVar72,2);
                bVar30 = (byte)uVar19;
                uVar19 = vpcmpuq_avx512f(auVar73,auVar72,2);
                bVar31 = (byte)uVar19;
                uVar53 = CONCAT11(bVar31,bVar30);
                piVar1 = (int *)(*pauVar49 + uVar46 * 4);
                auVar127._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
                auVar127._0_4_ = (uint)(bVar30 & 1) * *piVar1;
                auVar127._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
                auVar127._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
                auVar127._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
                auVar127._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
                auVar127._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
                auVar127._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
                auVar127._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
                auVar127._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
                auVar127._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
                auVar127._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
                auVar127._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
                auVar127._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
                auVar127._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
                auVar127._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
                auVar113 = vfmadd213ps_avx512f(auVar127,in_ZMM18,in_ZMM17);
                auVar73 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
                auVar67._0_4_ =
                     (uint)(bVar30 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar73._0_4_
                ;
                bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
                auVar67._4_4_ = (uint)bVar6 * auVar113._4_4_ | (uint)!bVar6 * auVar73._4_4_;
                bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
                auVar67._8_4_ = (uint)bVar6 * auVar113._8_4_ | (uint)!bVar6 * auVar73._8_4_;
                bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
                auVar67._12_4_ = (uint)bVar6 * auVar113._12_4_ | (uint)!bVar6 * auVar73._12_4_;
                bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
                auVar67._16_4_ = (uint)bVar6 * auVar113._16_4_ | (uint)!bVar6 * auVar73._16_4_;
                bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
                auVar67._20_4_ = (uint)bVar6 * auVar113._20_4_ | (uint)!bVar6 * auVar73._20_4_;
                bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
                auVar67._24_4_ = (uint)bVar6 * auVar113._24_4_ | (uint)!bVar6 * auVar73._24_4_;
                bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
                auVar67._28_4_ = (uint)bVar6 * auVar113._28_4_ | (uint)!bVar6 * auVar73._28_4_;
                auVar67._32_4_ =
                     (uint)(bVar31 & 1) * auVar113._32_4_ |
                     (uint)!(bool)(bVar31 & 1) * auVar73._32_4_;
                bVar6 = (bool)(bVar31 >> 1 & 1);
                auVar67._36_4_ = (uint)bVar6 * auVar113._36_4_ | (uint)!bVar6 * auVar73._36_4_;
                bVar6 = (bool)(bVar31 >> 2 & 1);
                auVar67._40_4_ = (uint)bVar6 * auVar113._40_4_ | (uint)!bVar6 * auVar73._40_4_;
                bVar6 = (bool)(bVar31 >> 3 & 1);
                auVar67._44_4_ = (uint)bVar6 * auVar113._44_4_ | (uint)!bVar6 * auVar73._44_4_;
                bVar6 = (bool)(bVar31 >> 4 & 1);
                auVar67._48_4_ = (uint)bVar6 * auVar113._48_4_ | (uint)!bVar6 * auVar73._48_4_;
                bVar6 = (bool)(bVar31 >> 5 & 1);
                auVar67._52_4_ = (uint)bVar6 * auVar113._52_4_ | (uint)!bVar6 * auVar73._52_4_;
                bVar6 = (bool)(bVar31 >> 6 & 1);
                auVar67._56_4_ = (uint)bVar6 * auVar113._56_4_ | (uint)!bVar6 * auVar73._56_4_;
                auVar67._60_4_ =
                     (uint)(bVar31 >> 7) * auVar113._60_4_ |
                     (uint)!(bool)(bVar31 >> 7) * auVar73._60_4_;
                *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar67;
                uVar46 = uVar46 + 0x10;
              } while (((ulong)(~uVar45 + uVar52) + 0x10 & 0x1fffffff0) != uVar46);
            }
          }
          else {
            pauVar37 = pauVar44;
            pauVar42 = pauVar50;
            if (bVar10 && 0xf < (int)uVar52) {
              iVar38 = 0x10;
              do {
                auVar67 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar42));
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar29._4_4_ = uVar3;
                auVar29._0_4_ = uVar3;
                auVar29._8_4_ = uVar3;
                auVar29._12_4_ = uVar3;
                auVar29._16_4_ = uVar3;
                auVar29._20_4_ = uVar3;
                auVar29._24_4_ = uVar3;
                auVar29._28_4_ = uVar3;
                auVar29._32_4_ = uVar3;
                auVar29._36_4_ = uVar3;
                auVar29._40_4_ = uVar3;
                auVar29._44_4_ = uVar3;
                auVar29._48_4_ = uVar3;
                auVar29._52_4_ = uVar3;
                auVar29._56_4_ = uVar3;
                auVar29._60_4_ = uVar3;
                auVar67 = vfmadd213ps_avx512f(auVar72,auVar67,auVar29);
                *pauVar49 = auVar67;
                pauVar49 = pauVar49 + 1;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                iVar38 = iVar38 + 0x10;
              } while (iVar38 <= (int)uVar52);
            }
            if (bVar8) {
              iVar38 = 8;
              if (0xf < (int)uVar52) {
                auVar72 = vinsertf64x4_avx512f(in_ZMM18,auVar63,1);
                in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar62,1);
                iVar40 = 0x10;
                do {
                  in_ZMM21 = ZEXT464(*(uint *)(*pauVar37 + 4));
                  auVar67 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar131,
                                              ZEXT464(*(uint *)(*pauVar42 + 4)));
                  in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar131,in_ZMM21);
                  auVar73 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar72);
                  auVar67 = vfmadd213ps_avx512f(auVar73,auVar67,in_ZMM20);
                  *pauVar49 = auVar67;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  iVar40 = iVar40 + 0x10;
                  iVar38 = uVar43 + 8;
                } while (iVar40 <= (int)uVar52);
              }
              for (; iVar38 <= (int)uVar52; iVar38 = iVar38 + 8) {
                uVar3 = *(undefined4 *)*pauVar42;
                auVar175._4_4_ = uVar3;
                auVar175._0_4_ = uVar3;
                auVar175._8_4_ = uVar3;
                auVar175._12_4_ = uVar3;
                auVar175._16_4_ = uVar3;
                auVar175._20_4_ = uVar3;
                auVar175._24_4_ = uVar3;
                auVar175._28_4_ = uVar3;
                auVar114._0_32_ =
                     vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar62,auVar63);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar26._16_4_ = uVar3;
                auVar26._20_4_ = uVar3;
                auVar26._24_4_ = uVar3;
                auVar26._28_4_ = uVar3;
                auVar67._0_32_ = vfmadd213ps_avx512vl(auVar114._0_32_,auVar175,auVar26);
                *(undefined1 (*) [32])*pauVar49 = auVar67._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar6) {
              uVar45 = 0;
              if (0xf < (int)uVar52) {
                auVar67 = vinsertf64x4_avx512f(in_ZMM18,auVar63,1);
                auVar72 = vpermpd_avx512f(auVar67,0x44);
                auVar67 = vinsertf64x4_avx512f(in_ZMM17,auVar62,1);
                in_ZMM19 = vpermpd_avx512f(auVar67,0x44);
                iVar38 = 0x10;
                do {
                  auVar67 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                  auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                  auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                             ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                  auVar114._0_32_ = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                  auVar67 = vinsertf64x4_avx512f(auVar67,auVar114._0_32_,0);
                  auVar113 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                  in_ZMM21 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                  auVar125._0_48_ = auVar67._0_48_;
                  auVar125._48_8_ = auVar73._48_8_;
                  auVar125._56_8_ = auVar73._56_8_;
                  in_ZMM22 = ZEXT464(*(uint *)(*pauVar37 + 4));
                  auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar114._0_32_ = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                  auVar67 = vinsertf64x4_avx512f(auVar113,auVar114._0_32_,0);
                  auVar126._0_48_ = auVar67._0_48_;
                  auVar126._48_8_ = in_ZMM21._48_8_;
                  auVar126._56_8_ = in_ZMM21._56_8_;
                  auVar67 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar72);
                  auVar67 = vfmadd213ps_avx512f(auVar67,auVar125,auVar126);
                  *pauVar49 = auVar67;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                  iVar38 = iVar38 + 0x10;
                  in_ZMM20 = auVar67;
                  uVar45 = uVar43;
                } while (iVar38 <= (int)uVar52);
              }
              if ((int)(uVar45 | 8) <= (int)uVar52) {
                auVar128._32_32_ = auVar67._32_32_;
                auVar63 = vpermpd_avx512vl(auVar63,0x44);
                auVar128._0_32_ = vpermpd_avx512vl(auVar62,0x44);
                in_ZMM19 = ZEXT3264(auVar128._0_32_);
                auVar67 = auVar128;
                uVar39 = uVar45;
                do {
                  auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar42),
                                        ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                  auVar55 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                             ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                  auVar62 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                  auVar114._0_32_ = vpermpd_avx2(ZEXT1632(auVar55),0x50);
                  auVar64 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [32])*pauVar49,auVar128._0_32_,auVar63);
                  auVar67._0_32_ = vfmadd213ps_avx512vl(auVar64,auVar62,auVar114._0_32_);
                  in_ZMM20 = ZEXT3264(auVar67._0_32_);
                  *(undefined1 (*) [32])*pauVar49 = auVar67._0_32_;
                  pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                  uVar45 = uVar39 + 8;
                  iVar38 = uVar39 + 0x10;
                  uVar39 = uVar45;
                } while (iVar38 <= (int)uVar52);
              }
              while (uVar45 = uVar45 + 4, (int)uVar45 <= (int)uVar52) {
                uVar3 = *(undefined4 *)*pauVar42;
                auVar167._4_4_ = uVar3;
                auVar167._0_4_ = uVar3;
                auVar167._8_4_ = uVar3;
                auVar167._12_4_ = uVar3;
                auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar57);
                uVar3 = *(undefined4 *)*pauVar37;
                auVar22._4_4_ = uVar3;
                auVar22._0_4_ = uVar3;
                auVar22._8_4_ = uVar3;
                auVar22._12_4_ = uVar3;
                auVar67._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar167,auVar22);
                *(undefined1 (*) [16])*pauVar49 = auVar67._0_16_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar9) {
              in_ZMM19 = vbroadcastss_avx512f(auVar57);
              in_ZMM20 = vbroadcastss_avx512f(auVar54);
              auVar67 = in_ZMM20;
              uVar45 = 0;
              if (0xf < (int)uVar52) {
                iVar38 = 0x10;
                do {
                  auVar67 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                  auVar67 = vfmadd213ps_avx512f(auVar67,*pauVar42,*pauVar37);
                  *pauVar49 = auVar67;
                  pauVar49 = pauVar49 + 1;
                  pauVar42 = pauVar42 + 1;
                  pauVar37 = pauVar37 + 1;
                  iVar38 = iVar38 + 0x10;
                  uVar45 = uVar43;
                } while (iVar38 <= (int)uVar52);
              }
              uVar39 = uVar45 | 8;
              while ((int)uVar39 <= (int)uVar52) {
                auVar67._0_32_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,in_ZMM19._0_32_);
                auVar58 = vfmadd213ps_fma(auVar67._0_32_,*(undefined1 (*) [32])*pauVar42,
                                          *(undefined1 (*) [32])*pauVar37);
                *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
                uVar39 = uVar45 + 0x10;
                uVar45 = uVar45 + 8;
              }
              iVar38 = uVar45 + 4;
              while (iVar38 <= (int)uVar52) {
                auVar67._0_16_ =
                     vfmadd132ps_avx512vl
                               (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,in_ZMM19._0_16_);
                auVar58 = vfmadd213ps_fma(auVar67._0_16_,*(undefined1 (*) [16])*pauVar42,
                                          *(undefined1 (*) [16])*pauVar37);
                *(undefined1 (*) [16])*pauVar49 = auVar58;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                iVar38 = uVar45 + 8;
                uVar45 = uVar45 + 4;
              }
              if (uVar52 - uVar45 != 0 && (int)uVar45 <= (int)uVar52) {
                lVar47 = 0;
                do {
                  auVar67._0_16_ =
                       vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,
                                           auVar57);
                  auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)),
                                            auVar67._0_16_,
                                            ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)));
                  *(int *)(*pauVar49 + lVar47 * 4) = auVar58._0_4_;
                  lVar47 = lVar47 + 1;
                } while (uVar52 - uVar45 != (int)lVar47);
              }
            }
          }
          uVar51 = uVar51 + 1;
        } while (uVar51 != uVar48);
      }
    }
    else if ((iVar38 == 2) && (0 < (int)uVar43)) {
      uVar48 = iVar40 * iVar36;
      fVar130 = 1.0 / (float)iVar40;
      auVar65 = vbroadcastss_avx512f(ZEXT416((uint)fVar130));
      uVar52 = uVar48 & 0xfffffff0;
      uVar51 = 0;
      auVar66 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar78._0_16_ = vxorps_avx512vl(auVar54,auVar54);
      auVar180._8_4_ = 0x80000000;
      auVar180._0_8_ = 0x8000000080000000;
      auVar180._12_4_ = 0x80000000;
      auVar183._8_4_ = 0xc0400000;
      auVar183._0_8_ = 0xc0400000c0400000;
      auVar183._12_4_ = 0xc0400000;
      auVar186._8_4_ = 0xc0400000;
      auVar186._0_8_ = 0xc0400000c0400000;
      auVar186._12_4_ = 0xc0400000;
      auVar186._16_4_ = 0xc0400000;
      auVar186._20_4_ = 0xc0400000;
      auVar186._24_4_ = 0xc0400000;
      auVar186._28_4_ = 0xc0400000;
      auVar188._8_4_ = 0x80000000;
      auVar188._0_8_ = 0x8000000080000000;
      auVar188._12_4_ = 0x80000000;
      auVar188._16_4_ = 0x80000000;
      auVar188._20_4_ = 0x80000000;
      auVar188._24_4_ = 0x80000000;
      auVar188._28_4_ = 0x80000000;
      auVar68 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar69 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar70 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar190 = auVar70;
      do {
        auVar58 = in_ZMM17._0_16_;
        auVar57 = in_ZMM22._0_16_;
        pauVar49 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar51 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar129 = auVar190._16_48_;
        auVar54 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        auVar190 = ZEXT1664(auVar54);
        pauVar37 = pauVar49;
        uVar45 = 0;
        if (0xf < (int)uVar48) {
          iVar38 = 0x10;
          do {
            auVar190 = vaddps_avx512f(auVar190,*pauVar37);
            auVar129 = auVar190._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar45 = uVar52;
          } while (iVar38 <= (int)uVar48);
        }
        auVar54 = auVar190._0_16_;
        uVar39 = uVar45 | 8;
        auVar71._0_16_ = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        auVar71._16_48_ = auVar129;
        auVar191 = ZEXT1664(auVar71._0_16_);
        auVar60 = auVar129._16_32_;
        auVar61 = ZEXT1632(auVar71._0_16_);
        while ((int)uVar39 <= (int)uVar48) {
          auVar71._0_32_ = vaddps_avx512vl(auVar191._0_32_,*(undefined1 (*) [32])*pauVar37);
          auVar191 = ZEXT3264(auVar71._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar45 + 0x10;
          uVar45 = uVar45 + 8;
          auVar60 = auVar71._32_32_;
          auVar61 = auVar71._0_32_;
        }
        auVar59 = auVar61._0_16_;
        iVar38 = uVar45 + 4;
        auVar55 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
        while (iVar38 <= (int)uVar48) {
          auVar55 = vaddps_avx512vl(auVar55,*(undefined1 (*) [16])*pauVar37);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar45 + 8;
          uVar45 = uVar45 + 4;
        }
        auVar56 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        in_ZMM19 = ZEXT1664(auVar56);
        auVar56 = ZEXT816(0) << 0x40;
        if ((int)uVar45 < (int)uVar48) {
          auVar72 = vpbroadcastq_avx512f();
          auVar57 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
          uVar46 = 0;
          auVar191 = ZEXT1664(auVar57);
          do {
            auVar113 = auVar191;
            auVar191 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar191,auVar66);
            auVar57 = auVar73._0_16_;
            auVar191 = vporq_avx512f(auVar191,auVar67);
            uVar19 = vpcmpuq_avx512f(auVar191,auVar72,2);
            bVar30 = (byte)uVar19;
            uVar19 = vpcmpuq_avx512f(auVar73,auVar72,2);
            bVar31 = (byte)uVar19;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar46 * 4);
            auVar74._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar74._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar74._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar74._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar74._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar74._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar74._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar74._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar74._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar74._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar74._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar74._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar74._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar74._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar74._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar74._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar191 = vaddps_avx512f(auVar74,auVar113);
            uVar46 = uVar46 + 0x10;
          } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          auVar75._0_4_ =
               (uint)(bVar30 & 1) * auVar191._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar113._0_4_;
          bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
          auVar75._4_4_ = (uint)bVar6 * auVar191._4_4_ | (uint)!bVar6 * auVar113._4_4_;
          bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
          auVar75._8_4_ = (uint)bVar6 * auVar191._8_4_ | (uint)!bVar6 * auVar113._8_4_;
          bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
          auVar75._12_4_ = (uint)bVar6 * auVar191._12_4_ | (uint)!bVar6 * auVar113._12_4_;
          bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
          auVar75._16_4_ = (uint)bVar6 * auVar191._16_4_ | (uint)!bVar6 * auVar113._16_4_;
          bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
          auVar75._20_4_ = (uint)bVar6 * auVar191._20_4_ | (uint)!bVar6 * auVar113._20_4_;
          bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
          auVar75._24_4_ = (uint)bVar6 * auVar191._24_4_ | (uint)!bVar6 * auVar113._24_4_;
          bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
          auVar75._28_4_ = (uint)bVar6 * auVar191._28_4_ | (uint)!bVar6 * auVar113._28_4_;
          auVar75._32_4_ =
               (uint)(bVar31 & 1) * auVar191._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar113._32_4_;
          bVar6 = (bool)(bVar31 >> 1 & 1);
          auVar75._36_4_ = (uint)bVar6 * auVar191._36_4_ | (uint)!bVar6 * auVar113._36_4_;
          bVar6 = (bool)(bVar31 >> 2 & 1);
          auVar75._40_4_ = (uint)bVar6 * auVar191._40_4_ | (uint)!bVar6 * auVar113._40_4_;
          bVar6 = (bool)(bVar31 >> 3 & 1);
          auVar75._44_4_ = (uint)bVar6 * auVar191._44_4_ | (uint)!bVar6 * auVar113._44_4_;
          bVar6 = (bool)(bVar31 >> 4 & 1);
          auVar75._48_4_ = (uint)bVar6 * auVar191._48_4_ | (uint)!bVar6 * auVar113._48_4_;
          bVar6 = (bool)(bVar31 >> 5 & 1);
          auVar75._52_4_ = (uint)bVar6 * auVar191._52_4_ | (uint)!bVar6 * auVar113._52_4_;
          bVar6 = (bool)(bVar31 >> 6 & 1);
          auVar75._56_4_ = (uint)bVar6 * auVar191._56_4_ | (uint)!bVar6 * auVar113._56_4_;
          auVar75._60_4_ =
               (uint)(bVar31 >> 7) * auVar191._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar113._60_4_;
          auVar60 = vextractf64x4_avx512f(auVar75,1);
          auVar191 = vaddps_avx512f(auVar75,ZEXT3264(auVar60));
          auVar58 = vextractf32x4_avx512vl(auVar191._0_32_,1);
          auVar56 = vaddps_avx512vl(auVar191._0_16_,auVar58);
          auVar58 = vshufpd_avx512vl(auVar56,auVar56,1);
          auVar56 = vaddps_avx512vl(auVar56,auVar58);
          auVar60 = auVar191._32_32_;
          auVar56 = vhaddps_avx(auVar56,auVar56);
        }
        in_ZMM20 = ZEXT464(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
        auVar57 = vpxord_avx512vl(auVar57,auVar57);
        in_ZMM22 = ZEXT1664(auVar57);
        auVar57 = vxorps_avx512vl(auVar58,auVar58);
        in_ZMM17 = ZEXT1664(auVar57);
        auVar57 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        bVar6 = false;
        auVar62 = auVar190._0_32_;
        auVar191 = ZEXT1664(auVar57);
        if (iVar36 < 8) {
          if (iVar36 == 1) {
            auVar63 = vextractf64x4_avx512f(auVar190,1);
            auVar62 = vaddps_avx512vl(auVar62,auVar63);
            auVar54 = vextractf32x4_avx512vl(auVar62,1);
            auVar54 = vaddps_avx512vl(auVar62._0_16_,auVar54);
            auVar58 = vshufpd_avx512vl(auVar54,auVar54,1);
            auVar57 = vextractf32x4_avx512vl(auVar61,1);
            auVar57 = vaddps_avx512vl(auVar57,auVar59);
            auVar59 = vshufps_avx512vl(auVar55,auVar57,0x11);
            auVar57 = vshufps_avx512vl(auVar55,auVar57,0xbb);
            auVar57 = vaddps_avx512vl(auVar57,auVar59);
            auVar59 = vshufpd_avx512vl(auVar57,auVar57,1);
            auVar57 = vaddps_avx512vl(auVar57,auVar59);
            auVar57 = vhaddps_avx(auVar57,auVar57);
            auVar58 = vaddps_avx512vl(auVar58,auVar54);
            auVar54 = vmovshdup_avx512vl(auVar58);
            auVar56 = vaddss_avx512f(auVar54,auVar56);
            auVar58 = vaddss_avx512f(auVar58,auVar56);
            auVar57 = vmulss_avx512f(ZEXT416((uint)(auVar58._0_4_ + auVar57._0_4_)),
                                     ZEXT416((uint)fVar130));
            in_ZMM19 = ZEXT1664(auVar57);
            auVar76._0_32_ = vbroadcastss_avx512vl(auVar57);
            auVar76._32_32_ = auVar60;
            auVar78._16_48_ = auVar76._16_48_;
            auVar77._4_60_ = auVar78._4_60_;
            auVar77._0_4_ = auVar76._0_4_;
            in_ZMM17 = ZEXT1664(auVar77._0_16_);
            bVar9 = true;
            bVar6 = false;
            auVar57 = auVar76._0_16_;
          }
          else {
            bVar9 = false;
            bVar8 = false;
            if (iVar36 != 4) goto LAB_004d4a5c;
            auVar60 = vextractf64x4_avx512f(auVar190,1);
            auVar61 = vaddps_avx512vl(auVar62,auVar61);
            fVar176 = auVar61._4_4_ + auVar60._4_4_;
            auVar150._0_4_ = auVar61._16_4_ + auVar60._16_4_ + auVar61._0_4_ + auVar60._0_4_;
            auVar150._4_4_ = fVar176 + fVar176;
            auVar150._8_4_ = auVar61._24_4_ + auVar60._24_4_ + auVar61._8_4_ + auVar60._8_4_;
            auVar150._12_4_ = auVar61._28_4_ + auVar60._28_4_ + auVar61._12_4_ + auVar60._12_4_;
            auVar57 = vaddps_avx512vl(auVar150,auVar55);
            auVar57 = vmulps_avx512vl(auVar57,auVar65._0_16_);
            in_ZMM17 = ZEXT1664(auVar57);
            auVar76._0_32_ = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar57,1);
            bVar6 = true;
            bVar9 = false;
            in_ZMM19 = in_ZMM17;
          }
          in_ZMM22 = ZEXT1664(auVar57);
          bVar8 = false;
          auVar191 = ZEXT3264(auVar76._0_32_);
LAB_004d4a5c:
          auVar60 = auVar191._0_32_;
          auVar190 = vinsertf64x4_avx512f(auVar191,auVar60,1);
          bVar10 = false;
        }
        else {
          if (iVar36 == 8) {
            auVar60 = vextractf64x4_avx512f(auVar190,1);
            auVar61 = vaddps_avx512vl(auVar62,auVar61);
            auVar168._0_4_ = auVar61._0_4_ + auVar60._0_4_;
            auVar168._4_4_ = auVar61._4_4_ + auVar60._4_4_;
            auVar168._8_4_ = auVar61._8_4_ + auVar60._8_4_;
            auVar168._12_4_ = auVar61._12_4_ + auVar60._12_4_;
            auVar168._16_4_ = auVar61._16_4_ + auVar60._16_4_;
            auVar168._20_4_ = auVar61._20_4_ + auVar60._20_4_;
            auVar168._24_4_ = auVar61._24_4_ + auVar60._24_4_;
            auVar168._28_4_ = auVar61._28_4_ + auVar60._28_4_;
            auVar60 = vmulps_avx512vl(auVar168,auVar65._0_32_);
            in_ZMM17 = ZEXT3264(auVar60);
            auVar57 = vbroadcastss_avx512vl(auVar60._0_16_);
            in_ZMM22 = ZEXT1664(auVar57);
            bVar8 = true;
            bVar6 = false;
            in_ZMM19 = ZEXT1664(auVar60._0_16_);
            bVar9 = false;
            auVar191 = in_ZMM17;
            goto LAB_004d4a5c;
          }
          bVar9 = false;
          bVar8 = false;
          if (iVar36 != 0x10) goto LAB_004d4a5c;
          auVar190 = vmulps_avx512f(auVar190,auVar65);
          auVar60 = vbroadcastss_avx512vl(auVar190._0_16_);
          bVar10 = true;
          bVar6 = false;
          bVar9 = false;
          in_ZMM22 = ZEXT1664(auVar60._0_16_);
          bVar8 = false;
          in_ZMM17 = auVar190;
          in_ZMM19 = auVar190;
        }
        auVar129 = auVar190._16_48_;
        pauVar37 = pauVar49;
        if ((int)uVar48 < 0x10) {
          auVar57 = vxorps_avx512vl(auVar59,auVar59);
          in_ZMM21 = ZEXT1664(auVar57);
          uVar45 = 0;
        }
        else {
          auVar57 = vxorps_avx512vl(auVar59,auVar59);
          in_ZMM21 = ZEXT1664(auVar57);
          iVar38 = 0x10;
          do {
            auVar191 = vsubps_avx512f(*pauVar37,auVar190);
            in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar191,auVar191);
            auVar129 = in_ZMM21._16_48_;
            pauVar37 = pauVar37 + 1;
            iVar38 = iVar38 + 0x10;
            uVar45 = uVar52;
          } while (iVar38 <= (int)uVar48);
        }
        uVar39 = uVar45 | 8;
        auVar79._0_16_ = vxorps_avx512vl(auVar55,auVar55);
        auVar79._16_48_ = auVar129;
        in_ZMM23 = ZEXT1664(auVar79._0_16_);
        while ((int)uVar39 <= (int)uVar48) {
          auVar61 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar37,auVar60);
          auVar79._0_32_ = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar61,auVar61);
          auVar129 = auVar79._16_48_;
          in_ZMM23 = ZEXT3264(auVar79._0_32_);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
          uVar39 = uVar45 + 0x10;
          uVar45 = uVar45 + 8;
        }
        iVar38 = uVar45 + 4;
        auVar57 = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
        while (iVar38 <= (int)uVar48) {
          auVar58 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar37,in_ZMM22._0_16_);
          auVar57 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar58);
          pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
          iVar38 = uVar45 + 8;
          uVar45 = uVar45 + 4;
        }
        auVar58 = ZEXT816(0) << 0x40;
        if ((int)uVar45 < (int)uVar48) {
          auVar190 = vpbroadcastq_avx512f();
          auVar191 = vbroadcastss_avx512f(in_ZMM19._0_16_);
          auVar54 = auVar191._0_16_;
          auVar58 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
          uVar46 = 0;
          in_ZMM26 = ZEXT1664(auVar58);
          do {
            auVar113 = in_ZMM26;
            auVar72 = vpbroadcastq_avx512f();
            auVar73 = vporq_avx512f(auVar72,auVar66);
            auVar72 = vporq_avx512f(auVar72,auVar67);
            uVar19 = vpcmpuq_avx512f(auVar72,auVar190,2);
            bVar30 = (byte)uVar19;
            uVar19 = vpcmpuq_avx512f(auVar73,auVar190,2);
            bVar31 = (byte)uVar19;
            uVar53 = CONCAT11(bVar31,bVar30);
            piVar1 = (int *)(*pauVar37 + uVar46 * 4);
            auVar80._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
            auVar80._0_4_ = (uint)(bVar30 & 1) * *piVar1;
            auVar80._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
            auVar80._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
            auVar80._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
            auVar80._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
            auVar80._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
            auVar80._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
            auVar80._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
            auVar80._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
            auVar80._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
            auVar80._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
            auVar80._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
            auVar80._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
            auVar80._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
            auVar80._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
            auVar72 = vsubps_avx512f(auVar80,auVar191);
            in_ZMM26 = vfmadd213ps_avx512f(auVar72,auVar72,auVar113);
            uVar46 = uVar46 + 0x10;
          } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          in_ZMM22._0_4_ =
               (uint)(bVar30 & 1) * in_ZMM26._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar113._0_4_;
          bVar7 = (bool)((byte)(uVar53 >> 1) & 1);
          in_ZMM22._4_4_ = (uint)bVar7 * in_ZMM26._4_4_ | (uint)!bVar7 * auVar113._4_4_;
          bVar7 = (bool)((byte)(uVar53 >> 2) & 1);
          in_ZMM22._8_4_ = (uint)bVar7 * in_ZMM26._8_4_ | (uint)!bVar7 * auVar113._8_4_;
          bVar7 = (bool)((byte)(uVar53 >> 3) & 1);
          in_ZMM22._12_4_ = (uint)bVar7 * in_ZMM26._12_4_ | (uint)!bVar7 * auVar113._12_4_;
          bVar7 = (bool)((byte)(uVar53 >> 4) & 1);
          in_ZMM22._16_4_ = (uint)bVar7 * in_ZMM26._16_4_ | (uint)!bVar7 * auVar113._16_4_;
          bVar7 = (bool)((byte)(uVar53 >> 5) & 1);
          in_ZMM22._20_4_ = (uint)bVar7 * in_ZMM26._20_4_ | (uint)!bVar7 * auVar113._20_4_;
          bVar7 = (bool)((byte)(uVar53 >> 6) & 1);
          in_ZMM22._24_4_ = (uint)bVar7 * in_ZMM26._24_4_ | (uint)!bVar7 * auVar113._24_4_;
          bVar7 = (bool)((byte)(uVar53 >> 7) & 1);
          in_ZMM22._28_4_ = (uint)bVar7 * in_ZMM26._28_4_ | (uint)!bVar7 * auVar113._28_4_;
          in_ZMM22._32_4_ =
               (uint)(bVar31 & 1) * in_ZMM26._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar113._32_4_;
          bVar7 = (bool)(bVar31 >> 1 & 1);
          in_ZMM22._36_4_ = (uint)bVar7 * in_ZMM26._36_4_ | (uint)!bVar7 * auVar113._36_4_;
          bVar7 = (bool)(bVar31 >> 2 & 1);
          in_ZMM22._40_4_ = (uint)bVar7 * in_ZMM26._40_4_ | (uint)!bVar7 * auVar113._40_4_;
          bVar7 = (bool)(bVar31 >> 3 & 1);
          in_ZMM22._44_4_ = (uint)bVar7 * in_ZMM26._44_4_ | (uint)!bVar7 * auVar113._44_4_;
          bVar7 = (bool)(bVar31 >> 4 & 1);
          in_ZMM22._48_4_ = (uint)bVar7 * in_ZMM26._48_4_ | (uint)!bVar7 * auVar113._48_4_;
          bVar7 = (bool)(bVar31 >> 5 & 1);
          in_ZMM22._52_4_ = (uint)bVar7 * in_ZMM26._52_4_ | (uint)!bVar7 * auVar113._52_4_;
          bVar7 = (bool)(bVar31 >> 6 & 1);
          in_ZMM22._56_4_ = (uint)bVar7 * in_ZMM26._56_4_ | (uint)!bVar7 * auVar113._56_4_;
          in_ZMM22._60_4_ =
               (uint)(bVar31 >> 7) * in_ZMM26._60_4_ | (uint)!(bool)(bVar31 >> 7) * auVar113._60_4_;
          auVar60 = vextractf64x4_avx512f(in_ZMM22,1);
          auVar190 = vaddps_avx512f(in_ZMM22,ZEXT3264(auVar60));
          auVar129 = auVar190._16_48_;
          auVar151._0_4_ = auVar190._0_4_ + auVar190._16_4_;
          auVar151._4_4_ = auVar190._4_4_ + auVar190._20_4_;
          auVar151._8_4_ = auVar190._8_4_ + auVar190._24_4_;
          auVar151._12_4_ = auVar190._12_4_ + auVar190._28_4_;
          auVar58 = vshufpd_avx(auVar151,auVar151,1);
          auVar152._0_4_ = auVar151._0_4_ + auVar58._0_4_;
          auVar152._4_4_ = auVar151._4_4_ + auVar58._4_4_;
          auVar152._8_4_ = auVar151._8_4_ + auVar58._8_4_;
          auVar152._12_4_ = auVar151._12_4_ + auVar58._12_4_;
          auVar58 = vhaddps_avx(auVar152,auVar152);
        }
        if (bVar10) {
          auVar190 = vmulps_avx512f(in_ZMM21,auVar65);
          in_ZMM18 = auVar190;
        }
        else {
          auVar190._0_16_ = vxorps_avx512vl(auVar54,auVar54);
          auVar190._16_48_ = auVar129;
          in_ZMM18 = ZEXT1664(auVar190._0_16_);
        }
        auVar60 = in_ZMM21._0_32_;
        if (bVar8) {
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar62 = vaddps_avx512vl(auVar60,in_ZMM23._0_32_);
          in_ZMM22 = ZEXT3264(auVar62);
          auVar61 = vaddps_avx512vl(auVar62,auVar61);
          in_ZMM23 = ZEXT3264(auVar61);
          auVar61 = vmulps_avx512vl(auVar61,auVar65._0_32_);
          auVar190 = vinsertf64x4_avx512f(in_ZMM18,auVar61,0);
          in_ZMM18 = auVar190;
        }
        if (bVar6) {
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar62 = vaddps_avx512vl(auVar60,in_ZMM23._0_32_);
          in_ZMM22 = ZEXT3264(auVar62);
          auVar61 = vaddps_avx512vl(auVar62,auVar61);
          in_ZMM23 = ZEXT3264(auVar61);
          auVar54 = vextractf32x4_avx512vl(auVar61,1);
          auVar54 = vaddps_avx512vl(auVar61._0_16_,auVar54);
          auVar57 = vaddps_avx512vl(auVar54,auVar57);
          auVar54 = vmulps_avx512vl(auVar57,auVar65._0_16_);
          auVar190 = vinsertf32x4_avx512f(in_ZMM18,auVar54,0);
          in_ZMM18 = auVar190;
        }
        in_ZMM24 = ZEXT1664(auVar57);
        if (bVar9) {
          auVar81._32_32_ = auVar190._32_32_;
          auVar61 = vextractf64x4_avx512f(in_ZMM21,1);
          auVar81._0_32_ = vaddps_avx512vl(auVar60,auVar61);
          auVar83._16_48_ = auVar81._16_48_;
          auVar54 = vextractf32x4_avx512vl(auVar81._0_32_,1);
          auVar55 = vaddps_avx512vl(auVar81._0_16_,auVar54);
          auVar59 = vshufpd_avx512vl(auVar55,auVar55,1);
          auVar54 = vextractf32x4_avx512vl(in_ZMM23._0_32_,1);
          auVar54 = vaddps_avx512vl(auVar54,in_ZMM23._0_16_);
          auVar56 = vshufps_avx512vl(auVar54,auVar57,0x11);
          auVar54 = vshufps_avx512vl(auVar54,auVar57,0xbb);
          auVar54 = vaddps_avx512vl(auVar54,auVar56);
          in_ZMM22 = ZEXT1664(auVar54);
          auVar57 = vshufpd_avx512vl(auVar54,auVar54,1);
          in_ZMM23 = ZEXT1664(auVar57);
          auVar54 = vaddps_avx512vl(auVar54,auVar57);
          auVar54 = vhaddps_avx(auVar54,auVar54);
          auVar57 = vaddps_avx512vl(auVar59,auVar55);
          auVar55 = vmovshdup_avx512vl(auVar57);
          in_ZMM21 = ZEXT1664(auVar55);
          auVar58 = vaddss_avx512f(auVar55,auVar58);
          auVar83._0_16_ = in_ZMM18._0_16_;
          auVar82._4_60_ = auVar83._4_60_;
          auVar82._0_4_ = (auVar57._0_4_ + auVar58._0_4_ + auVar54._0_4_) * fVar130;
          auVar190 = vinsertf32x4_avx512f(in_ZMM18,auVar82._0_16_,0);
          in_ZMM18 = auVar190;
        }
        auVar54 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var4[-3]));
        if (iVar36 < 8) {
          auVar85._16_48_ = auVar190._16_48_;
          auVar57 = in_ZMM18._0_16_;
          if (iVar36 == 1) {
            auVar58 = vaddss_avx512f(auVar57,auVar54);
            auVar54 = vrsqrtss_avx(auVar58,auVar58);
            auVar58 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar58._0_4_ * auVar54._0_4_)),auVar54,
                                          ZEXT416(0xc0400000));
            auVar54 = vmulss_avx512f(auVar54,ZEXT416(0xbf000000));
            fVar176 = auVar54._0_4_ * auVar58._0_4_;
            auVar85._0_16_ = auVar57;
            auVar84._4_60_ = auVar85._4_60_;
            auVar84._0_4_ = fVar176;
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar84._0_16_,0);
            auVar87._16_48_ = in_ZMM18._16_48_;
            auVar54 = vxorps_avx512vl(in_ZMM19._0_16_,auVar180);
            auVar87._0_16_ = in_ZMM17._0_16_;
            auVar86._4_60_ = auVar87._4_60_;
            auVar86._0_4_ = fVar176 * auVar54._0_4_;
            auVar190 = vinsertf32x4_avx512f(in_ZMM17,auVar86._0_16_,0);
            in_ZMM17 = auVar190;
          }
          else if (iVar36 == 4) {
            auVar54 = vbroadcastss_avx512vl(auVar54);
            auVar57 = vaddps_avx512vl(auVar57,auVar54);
            auVar54 = vrsqrtps_avx(auVar57);
            auVar153._0_4_ = auVar57._0_4_ * auVar54._0_4_;
            auVar153._4_4_ = auVar57._4_4_ * auVar54._4_4_;
            auVar153._8_4_ = auVar57._8_4_ * auVar54._8_4_;
            auVar153._12_4_ = auVar57._12_4_ * auVar54._12_4_;
            auVar57 = vfmadd213ps_fma(auVar153,auVar54,auVar183);
            auVar154._0_4_ = auVar54._0_4_ * -0.5 * auVar57._0_4_;
            auVar154._4_4_ = auVar54._4_4_ * -0.5 * auVar57._4_4_;
            auVar154._8_4_ = auVar54._8_4_ * -0.5 * auVar57._8_4_;
            auVar154._12_4_ = auVar54._12_4_ * -0.5 * auVar57._12_4_;
            auVar54 = vxorps_avx512vl(in_ZMM17._0_16_,auVar180);
            auVar177._0_4_ = auVar154._0_4_ * auVar54._0_4_;
            auVar177._4_4_ = auVar154._4_4_ * auVar54._4_4_;
            auVar177._8_4_ = auVar154._8_4_ * auVar54._8_4_;
            auVar177._12_4_ = auVar154._12_4_ * auVar54._12_4_;
            in_ZMM18 = vinsertf32x4_avx512f(in_ZMM18,auVar154,0);
            auVar190 = vinsertf32x4_avx512f(in_ZMM17,auVar177,0);
            in_ZMM17 = auVar190;
          }
        }
        else if (iVar36 == 8) {
          auVar60 = vbroadcastss_avx512vl(auVar54);
          auVar61 = vaddps_avx512vl(in_ZMM18._0_32_,auVar60);
          auVar60 = vrsqrtps_avx(auVar61);
          auVar32._4_4_ = auVar61._4_4_ * auVar60._4_4_;
          auVar32._0_4_ = auVar61._0_4_ * auVar60._0_4_;
          auVar32._8_4_ = auVar61._8_4_ * auVar60._8_4_;
          auVar32._12_4_ = auVar61._12_4_ * auVar60._12_4_;
          auVar32._16_4_ = auVar61._16_4_ * auVar60._16_4_;
          auVar32._20_4_ = auVar61._20_4_ * auVar60._20_4_;
          auVar32._24_4_ = auVar61._24_4_ * auVar60._24_4_;
          auVar32._28_4_ = auVar61._28_4_;
          auVar54 = vfmadd213ps_fma(auVar32,auVar60,auVar186);
          auVar169._0_4_ = auVar60._0_4_ * -0.5 * auVar54._0_4_;
          auVar169._4_4_ = auVar60._4_4_ * -0.5 * auVar54._4_4_;
          auVar169._8_4_ = auVar60._8_4_ * -0.5 * auVar54._8_4_;
          auVar169._12_4_ = auVar60._12_4_ * -0.5 * auVar54._12_4_;
          auVar169._16_4_ = auVar60._16_4_ * -0.5 * 0.0;
          auVar169._20_4_ = auVar60._20_4_ * -0.5 * 0.0;
          auVar169._24_4_ = auVar60._24_4_ * -0.5 * 0.0;
          auVar169._28_4_ = 0;
          auVar60 = vxorps_avx512vl(in_ZMM17._0_32_,auVar188);
          auVar33._4_4_ = auVar169._4_4_ * auVar60._4_4_;
          auVar33._0_4_ = auVar169._0_4_ * auVar60._0_4_;
          auVar33._8_4_ = auVar169._8_4_ * auVar60._8_4_;
          auVar33._12_4_ = auVar169._12_4_ * auVar60._12_4_;
          auVar33._16_4_ = auVar169._16_4_ * auVar60._16_4_;
          auVar33._20_4_ = auVar169._20_4_ * auVar60._20_4_;
          auVar33._24_4_ = auVar169._24_4_ * auVar60._24_4_;
          auVar33._28_4_ = auVar60._28_4_;
          in_ZMM18 = vinsertf64x4_avx512f(in_ZMM18,auVar169,0);
          auVar190 = vinsertf64x4_avx512f(in_ZMM17,auVar33,0);
          in_ZMM17 = auVar190;
        }
        else if (iVar36 == 0x10) {
          auVar190 = vbroadcastss_avx512f(auVar54);
          auVar190 = vaddps_avx512f(in_ZMM18,auVar190);
          auVar191 = vrsqrt14ps_avx512f(auVar190);
          auVar190 = vmulps_avx512f(auVar190,auVar191);
          auVar190 = vfmadd213ps_avx512f(auVar190,auVar191,auVar68);
          auVar191 = vmulps_avx512f(auVar191,auVar69);
          in_ZMM18 = vmulps_avx512f(auVar191,auVar190);
          auVar190 = vxorps_avx512dq(in_ZMM17,auVar70);
          auVar190 = vmulps_avx512f(in_ZMM18,auVar190);
          in_ZMM17 = auVar190;
        }
        auVar57 = in_ZMM18._0_16_;
        auVar60 = in_ZMM18._0_32_;
        auVar54 = in_ZMM17._0_16_;
        auVar61 = in_ZMM17._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var4[-3]) == 0) {
          auVar58 = auVar54;
          auVar55 = auVar57;
          if (!bVar6) {
            auVar55 = vbroadcastss_avx512vl(auVar57);
            auVar58 = vbroadcastss_avx512vl(auVar54);
          }
          in_ZMM20 = ZEXT1664(auVar58);
          in_ZMM19 = ZEXT1664(auVar55);
          if (!bVar8) {
            auVar60 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
            auVar61 = vinsertf32x4_avx512vl(ZEXT1632(auVar58),auVar58,1);
          }
          in_ZMM21 = ZEXT3264(auVar61);
          in_ZMM23 = in_ZMM17;
          in_ZMM22 = in_ZMM18;
          if (!bVar10) {
            in_ZMM22 = vinsertf64x4_avx512f(ZEXT3264(auVar60),auVar60,1);
            in_ZMM23 = vinsertf64x4_avx512f(in_ZMM21,auVar61,1);
          }
          auVar190 = in_ZMM23;
          uVar45 = 0;
          if (0xf < (int)uVar48) {
            iVar38 = 0x10;
            do {
              auVar190 = vfmadd132ps_avx512f(*pauVar49,in_ZMM23,in_ZMM22);
              *pauVar49 = auVar190;
              pauVar49 = pauVar49 + 1;
              iVar38 = iVar38 + 0x10;
              uVar45 = uVar52;
            } while (iVar38 <= (int)uVar48);
          }
          uVar39 = uVar45 | 8;
          while ((int)uVar39 <= (int)uVar48) {
            auVar190._0_32_ = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar61,auVar60);
            *(undefined1 (*) [32])*pauVar49 = auVar190._0_32_;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
            uVar39 = uVar45 + 0x10;
            uVar45 = uVar45 + 8;
          }
          iVar38 = uVar45 + 4;
          while (iVar38 <= (int)uVar48) {
            auVar190._0_16_ = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar58,auVar55);
            *(undefined1 (*) [16])*pauVar49 = auVar190._0_16_;
            pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
            iVar38 = uVar45 + 8;
            uVar45 = uVar45 + 4;
          }
          if ((int)uVar45 < (int)uVar48) {
            auVar191 = vpbroadcastq_avx512f();
            in_ZMM18 = vbroadcastss_avx512f(auVar57);
            in_ZMM17 = vbroadcastss_avx512f(auVar54);
            uVar46 = 0;
            do {
              auVar190 = vpbroadcastq_avx512f();
              auVar72 = vporq_avx512f(auVar190,auVar66);
              auVar190 = vporq_avx512f(auVar190,auVar67);
              uVar19 = vpcmpuq_avx512f(auVar190,auVar191,2);
              bVar30 = (byte)uVar19;
              uVar19 = vpcmpuq_avx512f(auVar72,auVar191,2);
              bVar31 = (byte)uVar19;
              uVar53 = CONCAT11(bVar31,bVar30);
              piVar1 = (int *)(*pauVar49 + uVar46 * 4);
              auVar90._4_4_ = (uint)((byte)(uVar53 >> 1) & 1) * piVar1[1];
              auVar90._0_4_ = (uint)(bVar30 & 1) * *piVar1;
              auVar90._8_4_ = (uint)((byte)(uVar53 >> 2) & 1) * piVar1[2];
              auVar90._12_4_ = (uint)((byte)(uVar53 >> 3) & 1) * piVar1[3];
              auVar90._16_4_ = (uint)((byte)(uVar53 >> 4) & 1) * piVar1[4];
              auVar90._20_4_ = (uint)((byte)(uVar53 >> 5) & 1) * piVar1[5];
              auVar90._24_4_ = (uint)((byte)(uVar53 >> 6) & 1) * piVar1[6];
              auVar90._28_4_ = (uint)((byte)(uVar53 >> 7) & 1) * piVar1[7];
              auVar90._32_4_ = (uint)(bVar31 & 1) * piVar1[8];
              auVar90._36_4_ = (uint)(bVar31 >> 1 & 1) * piVar1[9];
              auVar90._40_4_ = (uint)(bVar31 >> 2 & 1) * piVar1[10];
              auVar90._44_4_ = (uint)(bVar31 >> 3 & 1) * piVar1[0xb];
              auVar90._48_4_ = (uint)(bVar31 >> 4 & 1) * piVar1[0xc];
              auVar90._52_4_ = (uint)(bVar31 >> 5 & 1) * piVar1[0xd];
              auVar90._56_4_ = (uint)(bVar31 >> 6 & 1) * piVar1[0xe];
              auVar90._60_4_ = (uint)(bVar31 >> 7) * piVar1[0xf];
              auVar73 = vfmadd213ps_avx512f(auVar90,in_ZMM18,in_ZMM17);
              auVar72 = *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4);
              auVar190._0_4_ =
                   (uint)(bVar30 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar72._0_4_;
              bVar6 = (bool)((byte)(uVar53 >> 1) & 1);
              auVar190._4_4_ = (uint)bVar6 * auVar73._4_4_ | (uint)!bVar6 * auVar72._4_4_;
              bVar6 = (bool)((byte)(uVar53 >> 2) & 1);
              auVar190._8_4_ = (uint)bVar6 * auVar73._8_4_ | (uint)!bVar6 * auVar72._8_4_;
              bVar6 = (bool)((byte)(uVar53 >> 3) & 1);
              auVar190._12_4_ = (uint)bVar6 * auVar73._12_4_ | (uint)!bVar6 * auVar72._12_4_;
              bVar6 = (bool)((byte)(uVar53 >> 4) & 1);
              auVar190._16_4_ = (uint)bVar6 * auVar73._16_4_ | (uint)!bVar6 * auVar72._16_4_;
              bVar6 = (bool)((byte)(uVar53 >> 5) & 1);
              auVar190._20_4_ = (uint)bVar6 * auVar73._20_4_ | (uint)!bVar6 * auVar72._20_4_;
              bVar6 = (bool)((byte)(uVar53 >> 6) & 1);
              auVar190._24_4_ = (uint)bVar6 * auVar73._24_4_ | (uint)!bVar6 * auVar72._24_4_;
              bVar6 = (bool)((byte)(uVar53 >> 7) & 1);
              auVar190._28_4_ = (uint)bVar6 * auVar73._28_4_ | (uint)!bVar6 * auVar72._28_4_;
              auVar190._32_4_ =
                   (uint)(bVar31 & 1) * auVar73._32_4_ | (uint)!(bool)(bVar31 & 1) * auVar72._32_4_;
              bVar6 = (bool)(bVar31 >> 1 & 1);
              auVar190._36_4_ = (uint)bVar6 * auVar73._36_4_ | (uint)!bVar6 * auVar72._36_4_;
              bVar6 = (bool)(bVar31 >> 2 & 1);
              auVar190._40_4_ = (uint)bVar6 * auVar73._40_4_ | (uint)!bVar6 * auVar72._40_4_;
              bVar6 = (bool)(bVar31 >> 3 & 1);
              auVar190._44_4_ = (uint)bVar6 * auVar73._44_4_ | (uint)!bVar6 * auVar72._44_4_;
              bVar6 = (bool)(bVar31 >> 4 & 1);
              auVar190._48_4_ = (uint)bVar6 * auVar73._48_4_ | (uint)!bVar6 * auVar72._48_4_;
              bVar6 = (bool)(bVar31 >> 5 & 1);
              auVar190._52_4_ = (uint)bVar6 * auVar73._52_4_ | (uint)!bVar6 * auVar72._52_4_;
              bVar6 = (bool)(bVar31 >> 6 & 1);
              auVar190._56_4_ = (uint)bVar6 * auVar73._56_4_ | (uint)!bVar6 * auVar72._56_4_;
              auVar190._60_4_ =
                   (uint)(bVar31 >> 7) * auVar73._60_4_ |
                   (uint)!(bool)(bVar31 >> 7) * auVar72._60_4_;
              *(undefined1 (*) [64])(*pauVar49 + uVar46 * 4) = auVar190;
              uVar46 = uVar46 + 0x10;
            } while (((ulong)(~uVar45 + uVar48) + 0x10 & 0x1fffffff0) != uVar46);
          }
        }
        else {
          pauVar37 = pauVar50;
          pauVar42 = pauVar44;
          if (bVar10 && 0xf < (int)uVar48) {
            iVar38 = 0x10;
            do {
              auVar190 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar37));
              auVar191 = vfmadd132ps_avx512f(*pauVar49,in_ZMM17,in_ZMM18);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar27._4_4_ = uVar3;
              auVar27._0_4_ = uVar3;
              auVar27._8_4_ = uVar3;
              auVar27._12_4_ = uVar3;
              auVar27._16_4_ = uVar3;
              auVar27._20_4_ = uVar3;
              auVar27._24_4_ = uVar3;
              auVar27._28_4_ = uVar3;
              auVar27._32_4_ = uVar3;
              auVar27._36_4_ = uVar3;
              auVar27._40_4_ = uVar3;
              auVar27._44_4_ = uVar3;
              auVar27._48_4_ = uVar3;
              auVar27._52_4_ = uVar3;
              auVar27._56_4_ = uVar3;
              auVar27._60_4_ = uVar3;
              auVar190 = vfmadd213ps_avx512f(auVar191,auVar190,auVar27);
              *pauVar49 = auVar190;
              pauVar49 = pauVar49 + 1;
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
              iVar38 = iVar38 + 0x10;
            } while (iVar38 <= (int)uVar48);
          }
          if (bVar8) {
            iVar38 = 8;
            if (0xf < (int)uVar48) {
              auVar191 = vinsertf64x4_avx512f(in_ZMM18,auVar60,1);
              in_ZMM19 = vinsertf64x4_avx512f(in_ZMM17,auVar61,1);
              iVar40 = 0x10;
              do {
                in_ZMM21 = ZEXT464(*(uint *)(*pauVar42 + 4));
                auVar190 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar37),auVar131,
                                             ZEXT464(*(uint *)(*pauVar37 + 4)));
                in_ZMM20 = vpermt2ps_avx512f(ZEXT464(*(uint *)*pauVar42),auVar131,in_ZMM21);
                auVar72 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar191);
                auVar190 = vfmadd213ps_avx512f(auVar72,auVar190,in_ZMM20);
                *pauVar49 = auVar190;
                pauVar49 = pauVar49 + 1;
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                iVar40 = iVar40 + 0x10;
                iVar38 = uVar52 + 8;
              } while (iVar40 <= (int)uVar48);
            }
            for (; iVar38 <= (int)uVar48; iVar38 = iVar38 + 8) {
              uVar3 = *(undefined4 *)*pauVar37;
              auVar170._4_4_ = uVar3;
              auVar170._0_4_ = uVar3;
              auVar170._8_4_ = uVar3;
              auVar170._12_4_ = uVar3;
              auVar170._16_4_ = uVar3;
              auVar170._20_4_ = uVar3;
              auVar170._24_4_ = uVar3;
              auVar170._28_4_ = uVar3;
              auVar62 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar49,auVar61,auVar60);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar24._4_4_ = uVar3;
              auVar24._0_4_ = uVar3;
              auVar24._8_4_ = uVar3;
              auVar24._12_4_ = uVar3;
              auVar24._16_4_ = uVar3;
              auVar24._20_4_ = uVar3;
              auVar24._24_4_ = uVar3;
              auVar24._28_4_ = uVar3;
              auVar190._0_32_ = vfmadd213ps_avx512vl(auVar62,auVar170,auVar24);
              *(undefined1 (*) [32])*pauVar49 = auVar190._0_32_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          if (bVar6) {
            uVar45 = 0;
            if (0xf < (int)uVar48) {
              auVar190 = vinsertf64x4_avx512f(in_ZMM18,auVar60,1);
              auVar191 = vpermpd_avx512f(auVar190,0x44);
              auVar190 = vinsertf64x4_avx512f(in_ZMM17,auVar61,1);
              in_ZMM19 = vpermpd_avx512f(auVar190,0x44);
              iVar38 = 0x10;
              do {
                auVar190 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 8)));
                auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + 0xc)));
                auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar37),
                                           ZEXT416(*(uint *)(*pauVar37 + 4)),0);
                auVar62 = vpermpd_avx512vl(ZEXT1632(auVar58),0x50);
                auVar190 = vinsertf64x4_avx512f(auVar190,auVar62,0);
                auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 8)));
                in_ZMM21 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar42 + 0xc)));
                auVar88._0_48_ = auVar190._0_48_;
                auVar88._48_8_ = auVar72._48_8_;
                auVar88._56_8_ = auVar72._56_8_;
                in_ZMM22 = ZEXT464(*(uint *)(*pauVar42 + 4));
                auVar58 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                           ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                auVar62 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                auVar190 = vinsertf64x4_avx512f(auVar73,auVar62,0);
                auVar89._0_48_ = auVar190._0_48_;
                auVar89._48_8_ = in_ZMM21._48_8_;
                auVar89._56_8_ = in_ZMM21._56_8_;
                auVar190 = vfmadd132ps_avx512f(*pauVar49,in_ZMM19,auVar191);
                auVar190 = vfmadd213ps_avx512f(auVar190,auVar88,auVar89);
                *pauVar49 = auVar190;
                pauVar49 = pauVar49 + 1;
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                iVar38 = iVar38 + 0x10;
                in_ZMM20 = auVar190;
                uVar45 = uVar52;
              } while (iVar38 <= (int)uVar48);
            }
            if ((int)(uVar45 | 8) <= (int)uVar48) {
              auVar91._32_32_ = auVar190._32_32_;
              auVar60 = vpermpd_avx512vl(auVar60,0x44);
              auVar91._0_32_ = vpermpd_avx512vl(auVar61,0x44);
              in_ZMM19 = ZEXT3264(auVar91._0_32_);
              auVar190 = auVar91;
              uVar39 = uVar45;
              do {
                auVar58 = vshufps_avx(ZEXT416(*(uint *)*pauVar37),ZEXT416(*(uint *)(*pauVar37 + 4)),
                                      0);
                auVar55 = vshufps_avx512vl(ZEXT416(*(uint *)*pauVar42),
                                           ZEXT416(*(uint *)(*pauVar42 + 4)),0);
                auVar61 = vpermpd_avx2(ZEXT1632(auVar58),0x50);
                auVar62 = vpermpd_avx2(ZEXT1632(auVar55),0x50);
                auVar63 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])*pauVar49,auVar91._0_32_,auVar60);
                auVar190._0_32_ = vfmadd213ps_avx512vl(auVar63,auVar61,auVar62);
                in_ZMM20 = ZEXT3264(auVar190._0_32_);
                *(undefined1 (*) [32])*pauVar49 = auVar190._0_32_;
                pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 8);
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 8);
                uVar45 = uVar39 + 8;
                iVar38 = uVar39 + 0x10;
                uVar39 = uVar45;
              } while (iVar38 <= (int)uVar48);
            }
            while (uVar45 = uVar45 + 4, (int)uVar45 <= (int)uVar48) {
              uVar3 = *(undefined4 *)*pauVar37;
              auVar155._4_4_ = uVar3;
              auVar155._0_4_ = uVar3;
              auVar155._8_4_ = uVar3;
              auVar155._12_4_ = uVar3;
              auVar58 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar49,auVar54,auVar57);
              uVar3 = *(undefined4 *)*pauVar42;
              auVar20._4_4_ = uVar3;
              auVar20._0_4_ = uVar3;
              auVar20._8_4_ = uVar3;
              auVar20._12_4_ = uVar3;
              auVar190._0_16_ = vfmadd213ps_avx512vl(auVar58,auVar155,auVar20);
              *(undefined1 (*) [16])*pauVar49 = auVar190._0_16_;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          if (bVar9) {
            in_ZMM19 = vbroadcastss_avx512f(auVar57);
            in_ZMM20 = vbroadcastss_avx512f(auVar54);
            auVar190 = in_ZMM20;
            uVar45 = 0;
            if (0xf < (int)uVar48) {
              iVar38 = 0x10;
              do {
                auVar190 = vfmadd132ps_avx512f(*pauVar49,in_ZMM20,in_ZMM19);
                auVar190 = vfmadd213ps_avx512f(auVar190,*pauVar37,*pauVar42);
                *pauVar49 = auVar190;
                pauVar49 = pauVar49 + 1;
                pauVar37 = pauVar37 + 1;
                pauVar42 = pauVar42 + 1;
                iVar38 = iVar38 + 0x10;
                uVar45 = uVar52;
              } while (iVar38 <= (int)uVar48);
            }
            uVar39 = uVar45 | 8;
            while ((int)uVar39 <= (int)uVar48) {
              auVar190._0_32_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [32])*pauVar49,in_ZMM20._0_32_,in_ZMM19._0_32_);
              auVar58 = vfmadd213ps_fma(auVar190._0_32_,*(undefined1 (*) [32])*pauVar37,
                                        *(undefined1 (*) [32])*pauVar42);
              *(undefined1 (*) [32])*pauVar49 = ZEXT1632(auVar58);
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x20);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x20);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              uVar39 = uVar45 + 0x10;
              uVar45 = uVar45 + 8;
            }
            iVar38 = uVar45 + 4;
            while (iVar38 <= (int)uVar48) {
              auVar190._0_16_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [16])*pauVar49,in_ZMM20._0_16_,in_ZMM19._0_16_);
              auVar58 = vfmadd213ps_fma(auVar190._0_16_,*(undefined1 (*) [16])*pauVar37,
                                        *(undefined1 (*) [16])*pauVar42);
              *(undefined1 (*) [16])*pauVar49 = auVar58;
              pauVar49 = (undefined1 (*) [64])(*pauVar49 + 0x10);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 0x10);
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              iVar38 = uVar45 + 8;
              uVar45 = uVar45 + 4;
            }
            if (uVar48 - uVar45 != 0 && (int)uVar45 <= (int)uVar48) {
              lVar47 = 0;
              do {
                auVar190._0_16_ =
                     vfmadd132ss_avx512f(ZEXT416(*(uint *)(*pauVar49 + lVar47 * 4)),auVar54,auVar57)
                ;
                auVar58 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar37 + lVar47 * 4)),auVar190._0_16_
                                          ,ZEXT416(*(uint *)(*pauVar42 + lVar47 * 4)));
                *(int *)(*pauVar49 + lVar47 * 4) = auVar58._0_4_;
                lVar47 = lVar47 + 1;
              } while (uVar48 - uVar45 != (int)lVar47);
            }
          }
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != uVar43);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}